

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx2::CurveNiIntersector1<4>::
     intersect_h<embree::avx2::SweepCurve1Intersector1<embree::HermiteCurveT>,embree::avx2::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  Primitive PVar3;
  Geometry *pGVar4;
  long lVar5;
  RTCFilterFunctionN p_Var6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  int iVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [12];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  uint uVar65;
  ulong uVar66;
  undefined1 (*pauVar67) [32];
  uint uVar68;
  uint uVar69;
  long lVar70;
  uint uVar71;
  int iVar72;
  ulong uVar73;
  undefined4 uVar74;
  undefined8 uVar75;
  vint4 bi_2;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar82 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  float fVar101;
  float fVar102;
  float fVar124;
  float fVar125;
  vint4 bi_1;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [64];
  undefined1 auVar123 [64];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  float fVar145;
  float fVar167;
  float fVar168;
  vint4 ai_2;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  float fVar170;
  float fVar171;
  float fVar172;
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  float fVar169;
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  vint4 ai;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  float fVar190;
  float fVar208;
  float fVar209;
  vint4 bi;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar219 [16];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [64];
  vint4 ai_1;
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [28];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [64];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  float fVar241;
  undefined1 auVar238 [16];
  float fVar242;
  undefined1 auVar239 [32];
  float fVar243;
  float fVar244;
  float fVar245;
  undefined1 auVar240 [64];
  undefined1 auVar246 [16];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  float fVar250;
  float fVar251;
  undefined1 auVar249 [64];
  undefined1 auVar252 [32];
  undefined1 auVar253 [64];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [64];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [64];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  int local_acc;
  undefined1 local_aa0 [32];
  RTCFilterFunctionNArguments local_a78;
  int local_a44;
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_950 [16];
  undefined1 local_940 [8];
  float fStack_938;
  float fStack_934;
  undefined1 local_930 [16];
  undefined1 local_920 [16];
  undefined1 local_910 [16];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined8 local_8b0;
  float local_8a8;
  float local_8a4;
  undefined4 local_8a0;
  uint local_89c;
  uint local_898;
  uint local_894;
  uint local_890;
  undefined8 local_880;
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  undefined4 uStack_864;
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  undefined1 auStack_790 [16];
  undefined1 local_780 [32];
  undefined1 local_750 [16];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined4 local_6e0;
  undefined4 uStack_6dc;
  undefined4 uStack_6d8;
  undefined4 uStack_6d4;
  undefined4 uStack_6d0;
  undefined4 uStack_6cc;
  undefined4 uStack_6c8;
  undefined4 uStack_6c4;
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  undefined4 uStack_504;
  undefined1 local_500 [32];
  uint local_4e0;
  uint uStack_4dc;
  uint uStack_4d8;
  uint uStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  uint uStack_4c4;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  float local_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [32];
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  undefined8 uStack_140;
  int aiStack_138 [66];
  
  PVar3 = prim[1];
  uVar73 = (ulong)(byte)PVar3;
  fVar102 = *(float *)(prim + uVar73 * 0x19 + 0x12);
  auVar131 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                        *(undefined1 (*) [16])(prim + uVar73 * 0x19 + 6));
  auVar76._0_4_ = fVar102 * auVar131._0_4_;
  auVar76._4_4_ = fVar102 * auVar131._4_4_;
  auVar76._8_4_ = fVar102 * auVar131._8_4_;
  auVar76._12_4_ = fVar102 * auVar131._12_4_;
  auVar191._0_4_ = fVar102 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar191._4_4_ = fVar102 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar191._8_4_ = fVar102 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar191._12_4_ = fVar102 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar131 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 4 + 6)));
  auVar131 = vcvtdq2ps_avx(auVar131);
  auVar87 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 5 + 6)));
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 6 + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar176 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 0xb + 6)));
  auVar176 = vcvtdq2ps_avx(auVar176);
  auVar197 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6)));
  auVar197 = vcvtdq2ps_avx(auVar197);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar3 * 0xc + uVar73 + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  uVar66 = (ulong)(uint)((int)(uVar73 * 9) * 2);
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 + 6)));
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 + uVar73 + 6)));
  auVar78 = vcvtdq2ps_avx(auVar78);
  uVar66 = (ulong)(uint)((int)(uVar73 * 5) << 2);
  auVar130 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 + 6)));
  auVar130 = vcvtdq2ps_avx(auVar130);
  auVar259._4_4_ = auVar191._0_4_;
  auVar259._0_4_ = auVar191._0_4_;
  auVar259._8_4_ = auVar191._0_4_;
  auVar259._12_4_ = auVar191._0_4_;
  auVar104 = vshufps_avx(auVar191,auVar191,0x55);
  auVar77 = vshufps_avx(auVar191,auVar191,0xaa);
  fVar102 = auVar77._0_4_;
  auVar246._0_4_ = fVar102 * auVar8._0_4_;
  fVar124 = auVar77._4_4_;
  auVar246._4_4_ = fVar124 * auVar8._4_4_;
  fVar125 = auVar77._8_4_;
  auVar246._8_4_ = fVar125 * auVar8._8_4_;
  fVar126 = auVar77._12_4_;
  auVar246._12_4_ = fVar126 * auVar8._12_4_;
  auVar238._0_4_ = auVar9._0_4_ * fVar102;
  auVar238._4_4_ = auVar9._4_4_ * fVar124;
  auVar238._8_4_ = auVar9._8_4_ * fVar125;
  auVar238._12_4_ = auVar9._12_4_ * fVar126;
  auVar227._0_4_ = auVar130._0_4_ * fVar102;
  auVar227._4_4_ = auVar130._4_4_ * fVar124;
  auVar227._8_4_ = auVar130._8_4_ * fVar125;
  auVar227._12_4_ = auVar130._12_4_ * fVar126;
  auVar77 = vfmadd231ps_fma(auVar246,auVar104,auVar87);
  auVar105 = vfmadd231ps_fma(auVar238,auVar104,auVar197);
  auVar104 = vfmadd231ps_fma(auVar227,auVar78,auVar104);
  auVar146 = vfmadd231ps_fma(auVar77,auVar259,auVar131);
  auVar105 = vfmadd231ps_fma(auVar105,auVar259,auVar176);
  auVar174 = vfmadd231ps_fma(auVar104,auVar79,auVar259);
  auVar260._4_4_ = auVar76._0_4_;
  auVar260._0_4_ = auVar76._0_4_;
  auVar260._8_4_ = auVar76._0_4_;
  auVar260._12_4_ = auVar76._0_4_;
  auVar104 = vshufps_avx(auVar76,auVar76,0x55);
  auVar77 = vshufps_avx(auVar76,auVar76,0xaa);
  fVar102 = auVar77._0_4_;
  auVar192._0_4_ = fVar102 * auVar8._0_4_;
  fVar124 = auVar77._4_4_;
  auVar192._4_4_ = fVar124 * auVar8._4_4_;
  fVar125 = auVar77._8_4_;
  auVar192._8_4_ = fVar125 * auVar8._8_4_;
  fVar126 = auVar77._12_4_;
  auVar192._12_4_ = fVar126 * auVar8._12_4_;
  auVar103._0_4_ = auVar9._0_4_ * fVar102;
  auVar103._4_4_ = auVar9._4_4_ * fVar124;
  auVar103._8_4_ = auVar9._8_4_ * fVar125;
  auVar103._12_4_ = auVar9._12_4_ * fVar126;
  auVar77._0_4_ = auVar130._0_4_ * fVar102;
  auVar77._4_4_ = auVar130._4_4_ * fVar124;
  auVar77._8_4_ = auVar130._8_4_ * fVar125;
  auVar77._12_4_ = auVar130._12_4_ * fVar126;
  auVar87 = vfmadd231ps_fma(auVar192,auVar104,auVar87);
  auVar8 = vfmadd231ps_fma(auVar103,auVar104,auVar197);
  auVar197 = vfmadd231ps_fma(auVar77,auVar104,auVar78);
  auVar9 = vfmadd231ps_fma(auVar87,auVar260,auVar131);
  auVar78 = vfmadd231ps_fma(auVar8,auVar260,auVar176);
  auVar130 = vfmadd231ps_fma(auVar197,auVar260,auVar79);
  local_950._8_4_ = 0x7fffffff;
  local_950._0_8_ = 0x7fffffff7fffffff;
  local_950._12_4_ = 0x7fffffff;
  auVar131 = vandps_avx(auVar146,local_950);
  auVar173._8_4_ = 0x219392ef;
  auVar173._0_8_ = 0x219392ef219392ef;
  auVar173._12_4_ = 0x219392ef;
  auVar131 = vcmpps_avx(auVar131,auVar173,1);
  auVar87 = vblendvps_avx(auVar146,auVar173,auVar131);
  auVar131 = vandps_avx(auVar105,local_950);
  auVar131 = vcmpps_avx(auVar131,auVar173,1);
  auVar8 = vblendvps_avx(auVar105,auVar173,auVar131);
  auVar131 = vandps_avx(auVar174,local_950);
  auVar131 = vcmpps_avx(auVar131,auVar173,1);
  auVar131 = vblendvps_avx(auVar174,auVar173,auVar131);
  auVar176 = vrcpps_avx(auVar87);
  auVar219._8_4_ = 0x3f800000;
  auVar219._0_8_ = 0x3f8000003f800000;
  auVar219._12_4_ = 0x3f800000;
  auVar87 = vfnmadd213ps_fma(auVar87,auVar176,auVar219);
  auVar176 = vfmadd132ps_fma(auVar87,auVar176,auVar176);
  auVar87 = vrcpps_avx(auVar8);
  auVar8 = vfnmadd213ps_fma(auVar8,auVar87,auVar219);
  auVar197 = vfmadd132ps_fma(auVar8,auVar87,auVar87);
  auVar87 = vrcpps_avx(auVar131);
  auVar131 = vfnmadd213ps_fma(auVar131,auVar87,auVar219);
  auVar79 = vfmadd132ps_fma(auVar131,auVar87,auVar87);
  auVar131._8_8_ = 0;
  auVar131._0_8_ = *(ulong *)(prim + uVar73 * 7 + 6);
  auVar131 = vpmovsxwd_avx(auVar131);
  auVar131 = vcvtdq2ps_avx(auVar131);
  auVar131 = vsubps_avx(auVar131,auVar9);
  auVar174._0_4_ = auVar176._0_4_ * auVar131._0_4_;
  auVar174._4_4_ = auVar176._4_4_ * auVar131._4_4_;
  auVar174._8_4_ = auVar176._8_4_ * auVar131._8_4_;
  auVar174._12_4_ = auVar176._12_4_ * auVar131._12_4_;
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar73 * 9 + 6);
  auVar131 = vpmovsxwd_avx(auVar87);
  auVar131 = vcvtdq2ps_avx(auVar131);
  auVar131 = vsubps_avx(auVar131,auVar9);
  auVar193._0_4_ = auVar176._0_4_ * auVar131._0_4_;
  auVar193._4_4_ = auVar176._4_4_ * auVar131._4_4_;
  auVar193._8_4_ = auVar176._8_4_ * auVar131._8_4_;
  auVar193._12_4_ = auVar176._12_4_ * auVar131._12_4_;
  auVar105._1_3_ = 0;
  auVar105[0] = PVar3;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar87 = vpmovsxwd_avx(auVar8);
  auVar176._8_8_ = 0;
  auVar176._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar73 * -2 + 6);
  auVar131 = vpmovsxwd_avx(auVar176);
  auVar131 = vcvtdq2ps_avx(auVar131);
  auVar131 = vsubps_avx(auVar131,auVar78);
  auVar228._0_4_ = auVar131._0_4_ * auVar197._0_4_;
  auVar228._4_4_ = auVar131._4_4_ * auVar197._4_4_;
  auVar228._8_4_ = auVar131._8_4_ * auVar197._8_4_;
  auVar228._12_4_ = auVar131._12_4_ * auVar197._12_4_;
  auVar131 = vcvtdq2ps_avx(auVar87);
  auVar131 = vsubps_avx(auVar131,auVar78);
  auVar104._0_4_ = auVar197._0_4_ * auVar131._0_4_;
  auVar104._4_4_ = auVar197._4_4_ * auVar131._4_4_;
  auVar104._8_4_ = auVar197._8_4_ * auVar131._8_4_;
  auVar104._12_4_ = auVar197._12_4_ * auVar131._12_4_;
  auVar197._8_8_ = 0;
  auVar197._0_8_ = *(ulong *)(prim + uVar66 + uVar73 + 6);
  auVar131 = vpmovsxwd_avx(auVar197);
  auVar131 = vcvtdq2ps_avx(auVar131);
  auVar131 = vsubps_avx(auVar131,auVar130);
  auVar146._0_4_ = auVar79._0_4_ * auVar131._0_4_;
  auVar146._4_4_ = auVar79._4_4_ * auVar131._4_4_;
  auVar146._8_4_ = auVar79._8_4_ * auVar131._8_4_;
  auVar146._12_4_ = auVar79._12_4_ * auVar131._12_4_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar73 * 0x17 + 6);
  auVar131 = vpmovsxwd_avx(auVar9);
  auVar131 = vcvtdq2ps_avx(auVar131);
  auVar131 = vsubps_avx(auVar131,auVar130);
  auVar78._0_4_ = auVar79._0_4_ * auVar131._0_4_;
  auVar78._4_4_ = auVar79._4_4_ * auVar131._4_4_;
  auVar78._8_4_ = auVar79._8_4_ * auVar131._8_4_;
  auVar78._12_4_ = auVar79._12_4_ * auVar131._12_4_;
  auVar131 = vpminsd_avx(auVar174,auVar193);
  auVar87 = vpminsd_avx(auVar228,auVar104);
  auVar131 = vmaxps_avx(auVar131,auVar87);
  auVar87 = vpminsd_avx(auVar146,auVar78);
  uVar74 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar233._4_4_ = uVar74;
  auVar233._0_4_ = uVar74;
  auVar233._8_4_ = uVar74;
  auVar233._12_4_ = uVar74;
  auVar87 = vmaxps_avx(auVar87,auVar233);
  auVar131 = vmaxps_avx(auVar131,auVar87);
  local_420._0_4_ = auVar131._0_4_ * 0.99999964;
  local_420._4_4_ = auVar131._4_4_ * 0.99999964;
  local_420._8_4_ = auVar131._8_4_ * 0.99999964;
  local_420._12_4_ = auVar131._12_4_ * 0.99999964;
  auVar131 = vpmaxsd_avx(auVar174,auVar193);
  auVar87 = vpmaxsd_avx(auVar228,auVar104);
  auVar131 = vminps_avx(auVar131,auVar87);
  auVar87 = vpmaxsd_avx(auVar146,auVar78);
  fVar102 = (ray->super_RayK<1>).tfar;
  auVar130._4_4_ = fVar102;
  auVar130._0_4_ = fVar102;
  auVar130._8_4_ = fVar102;
  auVar130._12_4_ = fVar102;
  auVar87 = vminps_avx(auVar87,auVar130);
  auVar131 = vminps_avx(auVar131,auVar87);
  auVar79._0_4_ = auVar131._0_4_ * 1.0000004;
  auVar79._4_4_ = auVar131._4_4_ * 1.0000004;
  auVar79._8_4_ = auVar131._8_4_ * 1.0000004;
  auVar79._12_4_ = auVar131._12_4_ * 1.0000004;
  auVar105[4] = PVar3;
  auVar105._5_3_ = 0;
  auVar105[8] = PVar3;
  auVar105._9_3_ = 0;
  auVar105[0xc] = PVar3;
  auVar105._13_3_ = 0;
  auVar87 = vpcmpgtd_avx(auVar105,_DAT_01f7fcf0);
  auVar131 = vcmpps_avx(local_420,auVar79,2);
  auVar131 = vandps_avx(auVar131,auVar87);
  uVar65 = vmovmskps_avx(auVar131);
  if (uVar65 == 0) {
    return;
  }
  auVar91._16_16_ = mm_lookupmask_ps._240_16_;
  auVar91._0_16_ = mm_lookupmask_ps._240_16_;
  uVar65 = uVar65 & 0xff;
  local_340 = vblendps_avx(auVar91,ZEXT832(0) << 0x20,0x80);
  local_6e0 = 0x7fffffff;
  uStack_6dc = 0x7fffffff;
  uStack_6d8 = 0x7fffffff;
  uStack_6d4 = 0x7fffffff;
  uStack_6d0 = 0x7fffffff;
  uStack_6cc = 0x7fffffff;
  uStack_6c8 = 0x7fffffff;
  uStack_6c4 = 0x7fffffff;
  local_4e0 = 0x80000000;
  uStack_4dc = 0x80000000;
  uStack_4d8 = 0x80000000;
  uStack_4d4 = 0x80000000;
  fStack_4d0 = -0.0;
  fStack_4cc = -0.0;
  fStack_4c8 = -0.0;
  uStack_4c4 = 0x80000000;
LAB_015d92ef:
  lVar70 = 0;
  for (uVar66 = (ulong)uVar65; (uVar66 & 1) == 0; uVar66 = uVar66 >> 1 | 0x8000000000000000) {
    lVar70 = lVar70 + 1;
  }
  uVar71 = *(uint *)(prim + 2);
  pGVar4 = (context->scene->geometries).items[uVar71].ptr;
  lVar5 = *(long *)&pGVar4[1].time_range.upper;
  uVar66 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           (ulong)*(uint *)(prim + lVar70 * 4 + 6) *
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar131 = *(undefined1 (*) [16])(lVar5 + (long)pGVar4[1].intersectionFilterN * uVar66);
  auVar87 = *(undefined1 (*) [16])(lVar5 + (long)pGVar4[1].intersectionFilterN * (uVar66 + 1));
  auVar80._8_4_ = 0xbeaaaaab;
  auVar80._0_8_ = 0xbeaaaaabbeaaaaab;
  auVar80._12_4_ = 0xbeaaaaab;
  auVar79 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                              (pGVar4[2].intersectionFilterN +
                              uVar66 * (long)pGVar4[2].pointQueryFunc),auVar131,auVar80);
  auVar9 = vfmadd132ps_fma(*(undefined1 (*) [16])
                            (pGVar4[2].intersectionFilterN +
                            (long)pGVar4[2].pointQueryFunc * (uVar66 + 1)),auVar87,auVar80);
  auVar194._0_4_ = (auVar87._0_4_ + auVar131._0_4_ + auVar79._0_4_ + auVar9._0_4_) * 0.25;
  auVar194._4_4_ = (auVar87._4_4_ + auVar131._4_4_ + auVar79._4_4_ + auVar9._4_4_) * 0.25;
  auVar194._8_4_ = (auVar87._8_4_ + auVar131._8_4_ + auVar79._8_4_ + auVar9._8_4_) * 0.25;
  auVar194._12_4_ = (auVar87._12_4_ + auVar131._12_4_ + auVar79._12_4_ + auVar9._12_4_) * 0.25;
  aVar1 = (ray->super_RayK<1>).org.field_0;
  aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
  auVar8 = vsubps_avx(auVar194,(undefined1  [16])aVar1);
  auVar8 = vdpps_avx(auVar8,(undefined1  [16])aVar2,0x7f);
  auVar176 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
  auVar197 = vrcpss_avx(auVar176,auVar176);
  auVar176 = vfnmadd213ss_fma(auVar197,auVar176,ZEXT416(0x40000000));
  fVar102 = auVar8._0_4_ * auVar197._0_4_ * auVar176._0_4_;
  local_750 = ZEXT416((uint)fVar102);
  auVar195._4_4_ = fVar102;
  auVar195._0_4_ = fVar102;
  auVar195._8_4_ = fVar102;
  auVar195._12_4_ = fVar102;
  fStack_7d0 = fVar102;
  _local_7e0 = auVar195;
  fStack_7cc = fVar102;
  fStack_7c8 = fVar102;
  fStack_7c4 = fVar102;
  auVar8 = vfmadd231ps_fma((undefined1  [16])aVar1,(undefined1  [16])aVar2,auVar195);
  auVar8 = vblendps_avx(auVar8,_DAT_01f7aa10,8);
  local_910 = vsubps_avx(auVar131,auVar8);
  local_920 = vsubps_avx(auVar9,auVar8);
  local_930 = vsubps_avx(auVar79,auVar8);
  _local_940 = vsubps_avx(auVar87,auVar8);
  auVar131 = vmovshdup_avx(local_910);
  uVar75 = auVar131._0_8_;
  auVar214._8_8_ = uVar75;
  auVar214._0_8_ = uVar75;
  auVar214._16_8_ = uVar75;
  auVar214._24_8_ = uVar75;
  auVar131 = vshufps_avx(local_910,local_910,0xaa);
  local_1e0 = auVar131._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar131 = vshufps_avx(local_910,local_910,0xff);
  uVar75 = auVar131._0_8_;
  local_980._8_8_ = uVar75;
  local_980._0_8_ = uVar75;
  local_980._16_8_ = uVar75;
  local_980._24_8_ = uVar75;
  auVar265 = ZEXT3264(local_980);
  auVar131 = vmovshdup_avx(local_930);
  uVar75 = auVar131._0_8_;
  local_9a0._8_8_ = uVar75;
  local_9a0._0_8_ = uVar75;
  local_9a0._16_8_ = uVar75;
  local_9a0._24_8_ = uVar75;
  auVar253 = ZEXT3264(local_9a0);
  auVar131 = vshufps_avx(local_930,local_930,0xaa);
  uVar75 = auVar131._0_8_;
  local_9c0._8_8_ = uVar75;
  local_9c0._0_8_ = uVar75;
  local_9c0._16_8_ = uVar75;
  local_9c0._24_8_ = uVar75;
  auVar258 = ZEXT3264(local_9c0);
  auVar131 = vshufps_avx(local_930,local_930,0xff);
  uVar75 = auVar131._0_8_;
  auVar224._8_8_ = uVar75;
  auVar224._0_8_ = uVar75;
  auVar224._16_8_ = uVar75;
  auVar224._24_8_ = uVar75;
  auVar226 = ZEXT3264(auVar224);
  auVar131 = vmovshdup_avx(local_920);
  local_320 = auVar131._0_4_;
  fStack_31c = auVar131._4_4_;
  auVar131 = vshufps_avx(local_920,local_920,0xaa);
  local_200 = auVar131._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar131 = vshufps_avx(local_920,local_920,0xff);
  local_220 = auVar131._0_8_;
  uStack_218 = local_220;
  uStack_210 = local_220;
  uStack_208 = local_220;
  auVar131 = vmovshdup_avx(_local_940);
  local_240 = auVar131._0_8_;
  uStack_238 = local_240;
  uStack_230 = local_240;
  uStack_228 = local_240;
  auVar131 = vshufps_avx(_local_940,_local_940,0xaa);
  local_260 = auVar131._0_8_;
  uStack_258 = local_260;
  uStack_250 = local_260;
  uStack_248 = local_260;
  auVar131 = vshufps_avx(_local_940,_local_940,0xff);
  local_280 = auVar131._0_8_;
  uStack_278 = local_280;
  uStack_270 = local_280;
  uStack_268 = local_280;
  auVar81._0_4_ = aVar2.x * aVar2.x;
  auVar81._4_4_ = aVar2.y * aVar2.y;
  auVar81._8_4_ = aVar2.z * aVar2.z;
  auVar81._12_4_ = aVar2.field_3.w * aVar2.field_3.w;
  auVar131 = vshufps_avx(auVar81,auVar81,0xaa);
  uVar75 = auVar131._0_8_;
  auVar139._8_8_ = uVar75;
  auVar139._0_8_ = uVar75;
  auVar139._16_8_ = uVar75;
  auVar139._24_8_ = uVar75;
  uVar74 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
  local_680._4_4_ = uVar74;
  local_680._0_4_ = uVar74;
  fStack_678 = (float)uVar74;
  fStack_674 = (float)uVar74;
  fStack_670 = (float)uVar74;
  fStack_66c = (float)uVar74;
  fStack_668 = (float)uVar74;
  register0x0000125c = uVar74;
  uVar74 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
  local_6a0._4_4_ = uVar74;
  local_6a0._0_4_ = uVar74;
  fStack_698 = (float)uVar74;
  fStack_694 = (float)uVar74;
  fStack_690 = (float)uVar74;
  fStack_68c = (float)uVar74;
  fStack_688 = (float)uVar74;
  register0x0000149c = uVar74;
  auVar240 = ZEXT3264(_local_6a0);
  auVar131 = vfmadd231ps_fma(auVar139,_local_6a0,_local_6a0);
  auVar131 = vfmadd231ps_fma(ZEXT1632(auVar131),_local_680,_local_680);
  auVar249 = ZEXT1664(auVar131);
  local_acc = 1;
  uVar73 = 0;
  local_460 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fStack_45c = local_460;
  fStack_458 = local_460;
  fStack_454 = local_460;
  fStack_450 = local_460;
  fStack_44c = local_460;
  fStack_448 = local_460;
  fStack_444 = local_460;
  uVar74 = local_910._0_4_;
  local_900._4_4_ = uVar74;
  local_900._0_4_ = uVar74;
  local_900._8_4_ = uVar74;
  local_900._12_4_ = uVar74;
  local_900._16_4_ = uVar74;
  local_900._20_4_ = uVar74;
  local_900._24_4_ = uVar74;
  local_900._28_4_ = uVar74;
  auVar232 = ZEXT3264(local_900);
  uVar74 = local_930._0_4_;
  local_300._4_4_ = uVar74;
  local_300._0_4_ = uVar74;
  local_300._8_4_ = uVar74;
  local_300._12_4_ = uVar74;
  local_300._16_4_ = uVar74;
  local_300._20_4_ = uVar74;
  local_300._24_4_ = uVar74;
  local_300._28_4_ = uVar74;
  local_2c0 = local_920._0_4_;
  fStack_2bc = local_2c0;
  fStack_2b8 = local_2c0;
  fStack_2b4 = local_2c0;
  fStack_2b0 = local_2c0;
  fStack_2ac = local_2c0;
  fStack_2a8 = local_2c0;
  fStack_2a4 = local_2c0;
  local_2e0 = local_940._0_4_;
  fStack_2dc = local_2e0;
  fStack_2d8 = local_2e0;
  fStack_2d4 = local_2e0;
  fStack_2d0 = local_2e0;
  fStack_2cc = local_2e0;
  fStack_2c8 = local_2e0;
  fStack_2c4 = local_2e0;
  auVar10._4_4_ = uStack_6dc;
  auVar10._0_4_ = local_6e0;
  auVar10._8_4_ = uStack_6d8;
  auVar10._12_4_ = uStack_6d4;
  auVar10._16_4_ = uStack_6d0;
  auVar10._20_4_ = uStack_6cc;
  auVar10._24_4_ = uStack_6c8;
  auVar10._28_4_ = uStack_6c4;
  local_380 = vandps_avx(ZEXT1632(auVar131),auVar10);
  local_410 = ZEXT816(0x3f80000000000000);
  local_2a0 = ZEXT1632(auVar131);
  local_360 = auVar214;
  local_9e0 = auVar224;
  uVar66 = (ulong)*(uint *)(prim + lVar70 * 4 + 6);
  fStack_318 = local_320;
  fStack_314 = fStack_31c;
  fStack_310 = local_320;
  fStack_30c = fStack_31c;
  fStack_308 = local_320;
  fStack_304 = fStack_31c;
  do {
    auVar182._8_4_ = 0x3f800000;
    auVar182._0_8_ = 0x3f8000003f800000;
    auVar182._12_4_ = 0x3f800000;
    auVar182._16_4_ = 0x3f800000;
    auVar182._20_4_ = 0x3f800000;
    iVar72 = (int)uVar73;
    auVar182._24_4_ = 0x3f800000;
    auVar182._28_4_ = 0x3f800000;
    auVar131 = vmovshdup_avx(local_410);
    auVar131 = vsubps_avx(auVar131,local_410);
    fVar101 = auVar131._0_4_;
    fVar129 = fVar101 * 0.04761905;
    local_600._0_4_ = local_410._0_4_;
    local_600._4_4_ = local_600._0_4_;
    local_600._8_4_ = local_600._0_4_;
    local_600._12_4_ = local_600._0_4_;
    local_600._16_4_ = local_600._0_4_;
    local_600._20_4_ = local_600._0_4_;
    local_600._24_4_ = local_600._0_4_;
    local_600._28_4_ = local_600._0_4_;
    local_620._4_4_ = fVar101;
    local_620._0_4_ = fVar101;
    local_620._8_4_ = fVar101;
    local_620._12_4_ = fVar101;
    local_620._16_4_ = fVar101;
    local_620._20_4_ = fVar101;
    local_620._24_4_ = fVar101;
    local_620._28_4_ = fVar101;
    auVar131 = vfmadd231ps_fma(local_600,local_620,_DAT_01faff20);
    auVar91 = vsubps_avx(auVar182,ZEXT1632(auVar131));
    fVar102 = auVar131._0_4_;
    auVar122._0_4_ = local_300._0_4_ * fVar102;
    fVar124 = auVar131._4_4_;
    auVar122._4_4_ = local_300._4_4_ * fVar124;
    fVar125 = auVar131._8_4_;
    auVar122._8_4_ = local_300._8_4_ * fVar125;
    fVar126 = auVar131._12_4_;
    auVar122._12_4_ = local_300._12_4_ * fVar126;
    auVar122._16_4_ = local_300._16_4_ * 0.0;
    auVar122._20_4_ = local_300._20_4_ * 0.0;
    auVar122._28_36_ = auVar249._28_36_;
    auVar122._24_4_ = local_300._24_4_ * 0.0;
    auVar249._0_4_ = auVar253._0_4_ * fVar102;
    auVar249._4_4_ = auVar253._4_4_ * fVar124;
    auVar249._8_4_ = auVar253._8_4_ * fVar125;
    auVar249._12_4_ = auVar253._12_4_ * fVar126;
    auVar249._16_4_ = auVar253._16_4_ * 0.0;
    auVar249._20_4_ = auVar253._20_4_ * 0.0;
    auVar249._28_36_ = auVar240._28_36_;
    auVar249._24_4_ = auVar253._24_4_ * 0.0;
    auVar240._0_4_ = auVar258._0_4_ * fVar102;
    auVar240._4_4_ = auVar258._4_4_ * fVar124;
    auVar240._8_4_ = auVar258._8_4_ * fVar125;
    auVar240._12_4_ = auVar258._12_4_ * fVar126;
    auVar240._16_4_ = auVar258._16_4_ * 0.0;
    auVar240._20_4_ = auVar258._20_4_ * 0.0;
    auVar240._28_36_ = auVar226._28_36_;
    auVar240._24_4_ = auVar258._24_4_ * 0.0;
    auVar14._4_4_ = auVar224._4_4_ * fVar124;
    auVar14._0_4_ = auVar224._0_4_ * fVar102;
    auVar14._8_4_ = auVar224._8_4_ * fVar125;
    auVar14._12_4_ = auVar224._12_4_ * fVar126;
    auVar14._16_4_ = auVar224._16_4_ * 0.0;
    auVar14._20_4_ = auVar224._20_4_ * 0.0;
    auVar14._24_4_ = auVar224._24_4_ * 0.0;
    auVar14._28_4_ = fVar101;
    auVar131 = vfmadd231ps_fma(auVar122._0_32_,auVar91,auVar232._0_32_);
    auVar87 = vfmadd231ps_fma(auVar249._0_32_,auVar91,auVar214);
    auVar63._8_8_ = uStack_1d8;
    auVar63._0_8_ = local_1e0;
    auVar63._16_8_ = uStack_1d0;
    auVar63._24_8_ = uStack_1c8;
    auVar8 = vfmadd231ps_fma(auVar240._0_32_,auVar91,auVar63);
    auVar176 = vfmadd231ps_fma(auVar14,auVar91,auVar265._0_32_);
    auVar60._4_4_ = fStack_2bc;
    auVar60._0_4_ = local_2c0;
    auVar60._8_4_ = fStack_2b8;
    auVar60._12_4_ = fStack_2b4;
    auVar60._16_4_ = fStack_2b0;
    auVar60._20_4_ = fStack_2ac;
    auVar60._24_4_ = fStack_2a8;
    auVar60._28_4_ = fStack_2a4;
    auVar226._0_4_ = local_2c0 * fVar102;
    auVar226._4_4_ = fStack_2bc * fVar124;
    auVar226._8_4_ = fStack_2b8 * fVar125;
    auVar226._12_4_ = fStack_2b4 * fVar126;
    auVar226._16_4_ = fStack_2b0 * 0.0;
    auVar226._20_4_ = fStack_2ac * 0.0;
    auVar226._28_36_ = auVar232._28_36_;
    auVar226._24_4_ = fStack_2a8 * 0.0;
    auVar15._4_4_ = fVar124 * fStack_31c;
    auVar15._0_4_ = fVar102 * local_320;
    auVar15._8_4_ = fVar125 * fStack_318;
    auVar15._12_4_ = fVar126 * fStack_314;
    auVar15._16_4_ = fStack_310 * 0.0;
    auVar15._20_4_ = fStack_30c * 0.0;
    auVar15._24_4_ = fStack_308 * 0.0;
    auVar15._28_4_ = auVar214._28_4_;
    auVar62._8_8_ = uStack_1f8;
    auVar62._0_8_ = local_200;
    auVar62._16_8_ = uStack_1f0;
    auVar62._24_8_ = uStack_1e8;
    auVar16._4_4_ = (float)((ulong)local_200 >> 0x20) * fVar124;
    auVar16._0_4_ = (float)local_200 * fVar102;
    auVar16._8_4_ = (float)uStack_1f8 * fVar125;
    auVar16._12_4_ = (float)((ulong)uStack_1f8 >> 0x20) * fVar126;
    auVar16._16_4_ = (float)uStack_1f0 * 0.0;
    auVar16._20_4_ = (float)((ulong)uStack_1f0 >> 0x20) * 0.0;
    auVar16._24_4_ = (float)uStack_1e8 * 0.0;
    auVar16._28_4_ = 0x3f800000;
    auVar61._8_8_ = uStack_218;
    auVar61._0_8_ = local_220;
    auVar61._16_8_ = uStack_210;
    auVar61._24_8_ = uStack_208;
    auVar64._4_4_ = (float)((ulong)local_220 >> 0x20) * fVar124;
    auVar64._0_4_ = (float)local_220 * fVar102;
    auVar64._8_4_ = (float)uStack_218 * fVar125;
    auVar64._12_4_ = (float)((ulong)uStack_218 >> 0x20) * fVar126;
    auVar64._16_4_ = (float)uStack_210 * 0.0;
    auVar64._20_4_ = (float)((ulong)uStack_210 >> 0x20) * 0.0;
    auVar64._24_4_ = (float)uStack_208 * 0.0;
    auVar64._28_4_ = DAT_01faff20._28_4_;
    auVar197 = vfmadd231ps_fma(auVar226._0_32_,auVar91,local_300);
    auVar9 = vfmadd231ps_fma(auVar15,auVar91,auVar253._0_32_);
    auVar79 = vfmadd231ps_fma(auVar16,auVar91,auVar258._0_32_);
    auVar78 = vfmadd231ps_fma(auVar64,auVar91,auVar224);
    auVar265._0_4_ = fVar102 * local_2e0;
    auVar265._4_4_ = fVar124 * fStack_2dc;
    auVar265._8_4_ = fVar125 * fStack_2d8;
    auVar265._12_4_ = fVar126 * fStack_2d4;
    auVar265._16_4_ = fStack_2d0 * 0.0;
    auVar265._20_4_ = fStack_2cc * 0.0;
    auVar265._28_36_ = auVar258._28_36_;
    auVar265._24_4_ = fStack_2c8 * 0.0;
    auVar232._0_4_ = fVar102 * (float)local_240;
    auVar232._4_4_ = fVar124 * local_240._4_4_;
    auVar232._8_4_ = fVar125 * (float)uStack_238;
    auVar232._12_4_ = fVar126 * uStack_238._4_4_;
    auVar232._16_4_ = (float)uStack_230 * 0.0;
    auVar232._20_4_ = uStack_230._4_4_ * 0.0;
    auVar232._28_36_ = auVar253._28_36_;
    auVar232._24_4_ = (float)uStack_228 * 0.0;
    auVar52._28_4_ = auVar224._28_4_;
    auVar52._0_28_ =
         ZEXT1628(CONCAT412(auVar197._12_4_ * fVar126,
                            CONCAT48(auVar197._8_4_ * fVar125,
                                     CONCAT44(auVar197._4_4_ * fVar124,auVar197._0_4_ * fVar102))));
    auVar131 = vfmadd231ps_fma(auVar52,auVar91,ZEXT1632(auVar131));
    auVar87 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar126 * auVar9._12_4_,
                                                 CONCAT48(fVar125 * auVar9._8_4_,
                                                          CONCAT44(fVar124 * auVar9._4_4_,
                                                                   fVar102 * auVar9._0_4_)))),
                              auVar91,ZEXT1632(auVar87));
    auVar8 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar126 * auVar79._12_4_,
                                                CONCAT48(fVar125 * auVar79._8_4_,
                                                         CONCAT44(fVar124 * auVar79._4_4_,
                                                                  fVar102 * auVar79._0_4_)))),
                             auVar91,ZEXT1632(auVar8));
    auVar162._28_4_ = local_300._28_4_;
    auVar162._0_28_ =
         ZEXT1628(CONCAT412(fVar126 * auVar78._12_4_,
                            CONCAT48(fVar125 * auVar78._8_4_,
                                     CONCAT44(fVar124 * auVar78._4_4_,fVar102 * auVar78._0_4_))));
    auVar176 = vfmadd231ps_fma(auVar162,auVar91,ZEXT1632(auVar176));
    auVar222._0_4_ = fVar102 * (float)local_260;
    auVar222._4_4_ = fVar124 * local_260._4_4_;
    auVar222._8_4_ = fVar125 * (float)uStack_258;
    auVar222._12_4_ = fVar126 * uStack_258._4_4_;
    auVar222._16_4_ = (float)uStack_250 * 0.0;
    auVar222._20_4_ = uStack_250._4_4_ * 0.0;
    auVar222._24_4_ = (float)uStack_248 * 0.0;
    auVar222._28_4_ = 0;
    auVar130 = vfmadd231ps_fma(auVar265._0_32_,auVar91,auVar60);
    auVar197 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar130._12_4_ * fVar126,
                                                  CONCAT48(auVar130._8_4_ * fVar125,
                                                           CONCAT44(auVar130._4_4_ * fVar124,
                                                                    auVar130._0_4_ * fVar102)))),
                               auVar91,ZEXT1632(auVar197));
    auVar230._0_4_ = fVar102 * (float)local_280;
    auVar230._4_4_ = fVar124 * local_280._4_4_;
    auVar230._8_4_ = fVar125 * (float)uStack_278;
    auVar230._12_4_ = fVar126 * uStack_278._4_4_;
    auVar230._16_4_ = (float)uStack_270 * 0.0;
    auVar230._20_4_ = uStack_270._4_4_ * 0.0;
    auVar230._24_4_ = (float)uStack_268 * 0.0;
    auVar230._28_4_ = 0;
    auVar59._4_4_ = fStack_31c;
    auVar59._0_4_ = local_320;
    auVar59._8_4_ = fStack_318;
    auVar59._12_4_ = fStack_314;
    auVar59._16_4_ = fStack_310;
    auVar59._20_4_ = fStack_30c;
    auVar59._24_4_ = fStack_308;
    auVar59._28_4_ = fStack_304;
    auVar130 = vfmadd231ps_fma(auVar232._0_32_,auVar91,auVar59);
    auVar104 = vfmadd231ps_fma(auVar222,auVar91,auVar62);
    auVar77 = vfmadd231ps_fma(auVar230,auVar91,auVar61);
    auVar7._28_4_ = fStack_2a4;
    auVar7._0_28_ =
         ZEXT1628(CONCAT412(auVar77._12_4_ * fVar126,
                            CONCAT48(auVar77._8_4_ * fVar125,
                                     CONCAT44(auVar77._4_4_ * fVar124,auVar77._0_4_ * fVar102))));
    auVar9 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar130._12_4_ * fVar126,
                                                CONCAT48(auVar130._8_4_ * fVar125,
                                                         CONCAT44(auVar130._4_4_ * fVar124,
                                                                  auVar130._0_4_ * fVar102)))),
                             auVar91,ZEXT1632(auVar9));
    auVar79 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar126 * auVar104._12_4_,
                                                 CONCAT48(fVar125 * auVar104._8_4_,
                                                          CONCAT44(fVar124 * auVar104._4_4_,
                                                                   fVar102 * auVar104._0_4_)))),
                              auVar91,ZEXT1632(auVar79));
    auVar78 = vfmadd231ps_fma(auVar7,auVar91,ZEXT1632(auVar78));
    auVar161._28_4_ = (int)((ulong)uStack_208 >> 0x20);
    auVar161._0_28_ =
         ZEXT1628(CONCAT412(auVar9._12_4_ * fVar126,
                            CONCAT48(auVar9._8_4_ * fVar125,
                                     CONCAT44(auVar9._4_4_ * fVar124,auVar9._0_4_ * fVar102))));
    auVar12._28_4_ = (int)((ulong)uStack_1e8 >> 0x20);
    auVar12._0_28_ =
         ZEXT1628(CONCAT412(fVar126 * auVar79._12_4_,
                            CONCAT48(fVar125 * auVar79._8_4_,
                                     CONCAT44(fVar124 * auVar79._4_4_,fVar102 * auVar79._0_4_))));
    auVar130 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar197._12_4_ * fVar126,
                                                  CONCAT48(auVar197._8_4_ * fVar125,
                                                           CONCAT44(auVar197._4_4_ * fVar124,
                                                                    auVar197._0_4_ * fVar102)))),
                               auVar91,ZEXT1632(auVar131));
    auVar104 = vfmadd231ps_fma(auVar161,auVar91,ZEXT1632(auVar87));
    auVar162 = ZEXT1632(auVar104);
    auVar104 = vfmadd231ps_fma(auVar12,auVar91,ZEXT1632(auVar8));
    auVar77 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar78._12_4_ * fVar126,
                                                 CONCAT48(auVar78._8_4_ * fVar125,
                                                          CONCAT44(auVar78._4_4_ * fVar124,
                                                                   auVar78._0_4_ * fVar102)))),
                              ZEXT1632(auVar176),auVar91);
    auVar214 = vsubps_avx(ZEXT1632(auVar197),ZEXT1632(auVar131));
    auVar91 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar87));
    auVar224 = vsubps_avx(ZEXT1632(auVar79),ZEXT1632(auVar8));
    auVar10 = vsubps_avx(ZEXT1632(auVar78),ZEXT1632(auVar176));
    fVar190 = fVar129 * auVar214._0_4_ * 3.0;
    fVar208 = fVar129 * auVar214._4_4_ * 3.0;
    local_7c0._4_4_ = fVar208;
    local_7c0._0_4_ = fVar190;
    fVar209 = fVar129 * auVar214._8_4_ * 3.0;
    local_7c0._8_4_ = fVar209;
    fVar210 = fVar129 * auVar214._12_4_ * 3.0;
    local_7c0._12_4_ = fVar210;
    fVar211 = fVar129 * auVar214._16_4_ * 3.0;
    local_7c0._16_4_ = fVar211;
    fVar212 = fVar129 * auVar214._20_4_ * 3.0;
    local_7c0._20_4_ = fVar212;
    fVar213 = fVar129 * auVar214._24_4_ * 3.0;
    local_7c0._24_4_ = fVar213;
    local_7c0._28_4_ = 0x40400000;
    local_8e0._0_4_ = fVar129 * auVar91._0_4_ * 3.0;
    local_8e0._4_4_ = fVar129 * auVar91._4_4_ * 3.0;
    local_8e0._8_4_ = fVar129 * auVar91._8_4_ * 3.0;
    local_8e0._12_4_ = fVar129 * auVar91._12_4_ * 3.0;
    local_8e0._16_4_ = fVar129 * auVar91._16_4_ * 3.0;
    local_8e0._20_4_ = fVar129 * auVar91._20_4_ * 3.0;
    local_8e0._24_4_ = fVar129 * auVar91._24_4_ * 3.0;
    local_8e0._28_4_ = 0;
    local_5e0._0_4_ = fVar129 * auVar224._0_4_ * 3.0;
    local_5e0._4_4_ = fVar129 * auVar224._4_4_ * 3.0;
    local_5e0._8_4_ = fVar129 * auVar224._8_4_ * 3.0;
    local_5e0._12_4_ = fVar129 * auVar224._12_4_ * 3.0;
    local_5e0._16_4_ = fVar129 * auVar224._16_4_ * 3.0;
    local_5e0._20_4_ = fVar129 * auVar224._20_4_ * 3.0;
    local_5e0._24_4_ = fVar129 * auVar224._24_4_ * 3.0;
    local_5e0._28_4_ = 0;
    fVar102 = fVar129 * auVar10._0_4_ * 3.0;
    fVar124 = fVar129 * auVar10._4_4_ * 3.0;
    auVar11._4_4_ = fVar124;
    auVar11._0_4_ = fVar102;
    fVar125 = fVar129 * auVar10._8_4_ * 3.0;
    auVar11._8_4_ = fVar125;
    fVar126 = fVar129 * auVar10._12_4_ * 3.0;
    auVar11._12_4_ = fVar126;
    fVar127 = fVar129 * auVar10._16_4_ * 3.0;
    auVar11._16_4_ = fVar127;
    fVar128 = fVar129 * auVar10._20_4_ * 3.0;
    auVar11._20_4_ = fVar128;
    fVar129 = fVar129 * auVar10._24_4_ * 3.0;
    auVar11._24_4_ = fVar129;
    auVar11._28_4_ = auVar214._28_4_;
    local_a40 = ZEXT1632(auVar130);
    auVar139 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar130));
    local_780 = vpermps_avx2(_DAT_01fec480,auVar162);
    _local_7a0 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar104));
    local_4a0 = vsubps_avx(auVar139,local_a40);
    local_5a0 = vsubps_avx(_local_7a0,ZEXT1632(auVar104));
    fVar145 = local_5a0._0_4_;
    fVar167 = local_5a0._4_4_;
    auVar17._4_4_ = fVar167 * fVar208;
    auVar17._0_4_ = fVar145 * fVar190;
    fVar190 = local_5a0._8_4_;
    auVar17._8_4_ = fVar190 * fVar209;
    fVar208 = local_5a0._12_4_;
    auVar17._12_4_ = fVar208 * fVar210;
    fVar209 = local_5a0._16_4_;
    auVar17._16_4_ = fVar209 * fVar211;
    fVar210 = local_5a0._20_4_;
    auVar17._20_4_ = fVar210 * fVar212;
    fVar211 = local_5a0._24_4_;
    auVar17._24_4_ = fVar211 * fVar213;
    auVar17._28_4_ = auVar139._28_4_;
    auVar131 = vfmsub231ps_fma(auVar17,local_5e0,local_4a0);
    local_4c0 = vsubps_avx(local_780,auVar162);
    fVar212 = local_4a0._0_4_;
    fVar213 = local_4a0._4_4_;
    auVar18._4_4_ = fVar213 * local_8e0._4_4_;
    auVar18._0_4_ = fVar212 * local_8e0._0_4_;
    fVar241 = local_4a0._8_4_;
    auVar18._8_4_ = fVar241 * local_8e0._8_4_;
    fVar242 = local_4a0._12_4_;
    auVar18._12_4_ = fVar242 * local_8e0._12_4_;
    fVar243 = local_4a0._16_4_;
    auVar18._16_4_ = fVar243 * local_8e0._16_4_;
    fVar244 = local_4a0._20_4_;
    auVar18._20_4_ = fVar244 * local_8e0._20_4_;
    fVar245 = local_4a0._24_4_;
    auVar18._24_4_ = fVar245 * local_8e0._24_4_;
    auVar18._28_4_ = local_780._28_4_;
    auVar87 = vfmsub231ps_fma(auVar18,local_7c0,local_4c0);
    auVar19._28_4_ = local_7a0._28_4_;
    auVar19._0_28_ =
         ZEXT1628(CONCAT412(auVar87._12_4_ * auVar87._12_4_,
                            CONCAT48(auVar87._8_4_ * auVar87._8_4_,
                                     CONCAT44(auVar87._4_4_ * auVar87._4_4_,
                                              auVar87._0_4_ * auVar87._0_4_))));
    auVar131 = vfmadd231ps_fma(auVar19,ZEXT1632(auVar131),ZEXT1632(auVar131));
    fVar168 = local_4c0._0_4_;
    auVar92._0_4_ = fVar168 * local_5e0._0_4_;
    fVar169 = local_4c0._4_4_;
    auVar92._4_4_ = fVar169 * local_5e0._4_4_;
    fVar170 = local_4c0._8_4_;
    auVar92._8_4_ = fVar170 * local_5e0._8_4_;
    fVar171 = local_4c0._12_4_;
    auVar92._12_4_ = fVar171 * local_5e0._12_4_;
    fVar172 = local_4c0._16_4_;
    auVar92._16_4_ = fVar172 * local_5e0._16_4_;
    fVar250 = local_4c0._20_4_;
    auVar92._20_4_ = fVar250 * local_5e0._20_4_;
    fVar251 = local_4c0._24_4_;
    auVar92._24_4_ = fVar251 * local_5e0._24_4_;
    auVar92._28_4_ = 0;
    auVar8 = vfmsub231ps_fma(auVar92,local_8e0,local_5a0);
    auVar136._0_4_ = fVar145 * fVar145;
    auVar136._4_4_ = fVar167 * fVar167;
    auVar136._8_4_ = fVar190 * fVar190;
    auVar136._12_4_ = fVar208 * fVar208;
    auVar136._16_4_ = fVar209 * fVar209;
    auVar136._20_4_ = fVar210 * fVar210;
    auVar136._24_4_ = fVar211 * fVar211;
    auVar136._28_4_ = 0;
    auVar87 = vfmadd231ps_fma(auVar136,local_4c0,local_4c0);
    auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),local_4a0,local_4a0);
    auVar91 = vrcpps_avx(ZEXT1632(auVar87));
    auVar8 = vfmadd231ps_fma(ZEXT1632(auVar131),ZEXT1632(auVar8),ZEXT1632(auVar8));
    auVar254._8_4_ = 0x3f800000;
    auVar254._0_8_ = 0x3f8000003f800000;
    auVar254._12_4_ = 0x3f800000;
    auVar254._16_4_ = 0x3f800000;
    auVar254._20_4_ = 0x3f800000;
    auVar254._24_4_ = 0x3f800000;
    auVar254._28_4_ = 0x3f800000;
    auVar131 = vfnmadd213ps_fma(auVar91,ZEXT1632(auVar87),auVar254);
    auVar131 = vfmadd132ps_fma(ZEXT1632(auVar131),auVar91,auVar91);
    local_a00 = vpermps_avx2(_DAT_01fec480,local_7c0);
    local_a20 = vpermps_avx2(_DAT_01fec480,local_5e0);
    auVar20._4_4_ = local_a00._4_4_ * fVar167;
    auVar20._0_4_ = local_a00._0_4_ * fVar145;
    auVar20._8_4_ = local_a00._8_4_ * fVar190;
    auVar20._12_4_ = local_a00._12_4_ * fVar208;
    auVar20._16_4_ = local_a00._16_4_ * fVar209;
    auVar20._20_4_ = local_a00._20_4_ * fVar210;
    auVar20._24_4_ = local_a00._24_4_ * fVar211;
    auVar20._28_4_ = auVar91._28_4_;
    auVar176 = vfmsub231ps_fma(auVar20,local_a20,local_4a0);
    local_820 = vpermps_avx2(_DAT_01fec480,local_8e0);
    auVar21._4_4_ = fVar213 * local_820._4_4_;
    auVar21._0_4_ = fVar212 * local_820._0_4_;
    auVar21._8_4_ = fVar241 * local_820._8_4_;
    auVar21._12_4_ = fVar242 * local_820._12_4_;
    auVar21._16_4_ = fVar243 * local_820._16_4_;
    auVar21._20_4_ = fVar244 * local_820._20_4_;
    auVar21._24_4_ = fVar245 * local_820._24_4_;
    auVar21._28_4_ = 0x40400000;
    auVar15 = local_a00;
    auVar197 = vfmsub231ps_fma(auVar21,local_a00,local_4c0);
    auVar176 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar197._12_4_ * auVar197._12_4_,
                                                  CONCAT48(auVar197._8_4_ * auVar197._8_4_,
                                                           CONCAT44(auVar197._4_4_ * auVar197._4_4_,
                                                                    auVar197._0_4_ * auVar197._0_4_)
                                                          ))),ZEXT1632(auVar176),ZEXT1632(auVar176))
    ;
    auVar14 = local_a20;
    auVar183._0_4_ = fVar168 * local_a20._0_4_;
    auVar183._4_4_ = fVar169 * local_a20._4_4_;
    auVar183._8_4_ = fVar170 * local_a20._8_4_;
    auVar183._12_4_ = fVar171 * local_a20._12_4_;
    auVar183._16_4_ = fVar172 * local_a20._16_4_;
    auVar183._20_4_ = fVar250 * local_a20._20_4_;
    auVar183._24_4_ = fVar251 * local_a20._24_4_;
    auVar183._28_4_ = 0;
    auVar16 = local_820;
    auVar197 = vfmsub231ps_fma(auVar183,local_820,local_5a0);
    auVar176 = vfmadd231ps_fma(ZEXT1632(auVar176),ZEXT1632(auVar197),ZEXT1632(auVar197));
    auVar91 = vmaxps_avx(ZEXT1632(CONCAT412(auVar8._12_4_ * auVar131._12_4_,
                                            CONCAT48(auVar8._8_4_ * auVar131._8_4_,
                                                     CONCAT44(auVar8._4_4_ * auVar131._4_4_,
                                                              auVar8._0_4_ * auVar131._0_4_)))),
                         ZEXT1632(CONCAT412(auVar176._12_4_ * auVar131._12_4_,
                                            CONCAT48(auVar176._8_4_ * auVar131._8_4_,
                                                     CONCAT44(auVar176._4_4_ * auVar131._4_4_,
                                                              auVar176._0_4_ * auVar131._0_4_)))));
    local_660._0_4_ = auVar77._0_4_ + fVar102;
    local_660._4_4_ = auVar77._4_4_ + fVar124;
    local_660._8_4_ = auVar77._8_4_ + fVar125;
    local_660._12_4_ = auVar77._12_4_ + fVar126;
    local_660._16_4_ = fVar127 + 0.0;
    local_660._20_4_ = fVar128 + 0.0;
    local_660._24_4_ = fVar129 + 0.0;
    local_660._28_4_ = auVar214._28_4_ + 0.0;
    local_640 = ZEXT1632(auVar77);
    auVar214 = vsubps_avx(local_640,auVar11);
    _local_860 = vpermps_avx2(_DAT_01fec480,auVar214);
    _local_6c0 = vpermps_avx2(_DAT_01fec480,local_640);
    auVar214 = vmaxps_avx(local_640,local_660);
    auVar224 = vmaxps_avx(_local_860,_local_6c0);
    auVar10 = vrsqrtps_avx(ZEXT1632(auVar87));
    auVar214 = vmaxps_avx(auVar214,auVar224);
    fVar102 = auVar10._0_4_;
    fVar124 = auVar10._4_4_;
    fVar125 = auVar10._8_4_;
    fVar126 = auVar10._12_4_;
    fVar129 = auVar10._16_4_;
    fVar127 = auVar10._20_4_;
    fVar128 = auVar10._24_4_;
    auVar22._4_4_ = fVar124 * fVar124 * fVar124 * auVar87._4_4_ * -0.5;
    auVar22._0_4_ = fVar102 * fVar102 * fVar102 * auVar87._0_4_ * -0.5;
    auVar22._8_4_ = fVar125 * fVar125 * fVar125 * auVar87._8_4_ * -0.5;
    auVar22._12_4_ = fVar126 * fVar126 * fVar126 * auVar87._12_4_ * -0.5;
    auVar22._16_4_ = fVar129 * fVar129 * fVar129 * -0.0;
    auVar22._20_4_ = fVar127 * fVar127 * fVar127 * -0.0;
    auVar22._24_4_ = fVar128 * fVar128 * fVar128 * -0.0;
    auVar22._28_4_ = 0;
    auVar93._8_4_ = 0x3fc00000;
    auVar93._0_8_ = 0x3fc000003fc00000;
    auVar93._12_4_ = 0x3fc00000;
    auVar93._16_4_ = 0x3fc00000;
    auVar93._20_4_ = 0x3fc00000;
    auVar93._24_4_ = 0x3fc00000;
    auVar93._28_4_ = 0x3fc00000;
    auVar131 = vfmadd231ps_fma(auVar22,auVar93,auVar10);
    fVar124 = auVar131._0_4_;
    fVar125 = auVar131._4_4_;
    auVar23._4_4_ = fVar169 * fVar125;
    auVar23._0_4_ = fVar168 * fVar124;
    fVar129 = auVar131._8_4_;
    auVar23._8_4_ = fVar170 * fVar129;
    fVar128 = auVar131._12_4_;
    auVar23._12_4_ = fVar171 * fVar128;
    auVar23._16_4_ = fVar172 * 0.0;
    auVar23._20_4_ = fVar250 * 0.0;
    auVar23._24_4_ = fVar251 * 0.0;
    auVar23._28_4_ = 0x3fc00000;
    auVar261._0_4_ = local_460 * fVar145 * fVar124;
    auVar261._4_4_ = fStack_45c * fVar167 * fVar125;
    auVar261._8_4_ = fStack_458 * fVar190 * fVar129;
    auVar261._12_4_ = fStack_454 * fVar208 * fVar128;
    auVar261._16_4_ = fStack_450 * fVar209 * 0.0;
    auVar261._20_4_ = fStack_44c * fVar210 * 0.0;
    auVar261._24_4_ = fStack_448 * fVar211 * 0.0;
    auVar261._28_4_ = 0;
    auVar87 = vfmadd231ps_fma(auVar261,auVar23,_local_6a0);
    local_480 = ZEXT1632(auVar104);
    local_840 = vsubps_avx(ZEXT832(0) << 0x20,local_480);
    fVar168 = local_840._0_4_;
    fVar169 = local_840._4_4_;
    auVar24._4_4_ = fVar169 * fVar167 * fVar125;
    auVar24._0_4_ = fVar168 * fVar145 * fVar124;
    fVar145 = local_840._8_4_;
    auVar24._8_4_ = fVar145 * fVar190 * fVar129;
    fVar167 = local_840._12_4_;
    auVar24._12_4_ = fVar167 * fVar208 * fVar128;
    fVar170 = local_840._16_4_;
    auVar24._16_4_ = fVar170 * fVar209 * 0.0;
    fVar171 = local_840._20_4_;
    auVar24._20_4_ = fVar171 * fVar210 * 0.0;
    fVar172 = local_840._24_4_;
    auVar24._24_4_ = fVar172 * fVar211 * 0.0;
    auVar24._28_4_ = local_5a0._28_4_;
    auVar224 = vsubps_avx(ZEXT832(0) << 0x20,auVar162);
    auVar8 = vfmadd231ps_fma(auVar24,auVar224,auVar23);
    auVar25._4_4_ = fVar213 * fVar125;
    auVar25._0_4_ = fVar212 * fVar124;
    auVar25._8_4_ = fVar241 * fVar129;
    auVar25._12_4_ = fVar242 * fVar128;
    auVar25._16_4_ = fVar243 * 0.0;
    auVar25._20_4_ = fVar244 * 0.0;
    auVar25._24_4_ = fVar245 * 0.0;
    auVar25._28_4_ = 0x3fc00000;
    auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar25,_local_680);
    auVar160 = vsubps_avx(ZEXT832(0) << 0x20,local_a40);
    auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar160,auVar25);
    auVar226 = ZEXT1664(auVar8);
    auVar26._4_4_ = fVar169 * fStack_45c;
    auVar26._0_4_ = fVar168 * local_460;
    auVar26._8_4_ = fVar145 * fStack_458;
    auVar26._12_4_ = fVar167 * fStack_454;
    auVar26._16_4_ = fVar170 * fStack_450;
    auVar26._20_4_ = fVar171 * fStack_44c;
    auVar26._24_4_ = fVar172 * fStack_448;
    auVar26._28_4_ = 0x3fc00000;
    auVar176 = vfmadd231ps_fma(auVar26,_local_6a0,auVar224);
    auVar176 = vfmadd231ps_fma(ZEXT1632(auVar176),_local_680,auVar160);
    fVar102 = auVar8._0_4_;
    fVar212 = auVar87._0_4_;
    fVar126 = auVar8._4_4_;
    fVar213 = auVar87._4_4_;
    fVar127 = auVar8._8_4_;
    fVar241 = auVar87._8_4_;
    fVar190 = auVar8._12_4_;
    fVar242 = auVar87._12_4_;
    auVar10 = vsubps_avx(ZEXT1632(auVar176),
                         ZEXT1632(CONCAT412(fVar242 * fVar190,
                                            CONCAT48(fVar241 * fVar127,
                                                     CONCAT44(fVar213 * fVar126,fVar212 * fVar102)))
                                 ));
    auVar27._4_4_ = fVar169 * fVar169;
    auVar27._0_4_ = fVar168 * fVar168;
    auVar27._8_4_ = fVar145 * fVar145;
    auVar27._12_4_ = fVar167 * fVar167;
    auVar27._16_4_ = fVar170 * fVar170;
    auVar27._20_4_ = fVar171 * fVar171;
    auVar27._24_4_ = fVar172 * fVar172;
    auVar27._28_4_ = 0;
    auVar176 = vfmadd231ps_fma(auVar27,auVar224,auVar224);
    auVar176 = vfmadd231ps_fma(ZEXT1632(auVar176),auVar160,auVar160);
    auVar28._28_4_ = fStack_444;
    auVar28._0_28_ =
         ZEXT1628(CONCAT412(fVar190 * fVar190,
                            CONCAT48(fVar127 * fVar127,CONCAT44(fVar126 * fVar126,fVar102 * fVar102)
                                    )));
    local_700 = vsubps_avx(ZEXT1632(auVar176),auVar28);
    _local_560 = vsqrtps_avx(auVar91);
    fVar211 = local_560._28_4_ + auVar214._28_4_;
    fVar102 = (local_560._0_4_ + auVar214._0_4_) * 1.0000002;
    fVar126 = (local_560._4_4_ + auVar214._4_4_) * 1.0000002;
    fVar127 = (local_560._8_4_ + auVar214._8_4_) * 1.0000002;
    fVar190 = (local_560._12_4_ + auVar214._12_4_) * 1.0000002;
    fVar208 = (local_560._16_4_ + auVar214._16_4_) * 1.0000002;
    fVar209 = (local_560._20_4_ + auVar214._20_4_) * 1.0000002;
    fVar210 = (local_560._24_4_ + auVar214._24_4_) * 1.0000002;
    auVar29._4_4_ = fVar126 * fVar126;
    auVar29._0_4_ = fVar102 * fVar102;
    auVar29._8_4_ = fVar127 * fVar127;
    auVar29._12_4_ = fVar190 * fVar190;
    auVar29._16_4_ = fVar208 * fVar208;
    auVar29._20_4_ = fVar209 * fVar209;
    auVar29._24_4_ = fVar210 * fVar210;
    auVar29._28_4_ = fVar211;
    auVar236._0_4_ = auVar10._0_4_ + auVar10._0_4_;
    auVar236._4_4_ = auVar10._4_4_ + auVar10._4_4_;
    auVar236._8_4_ = auVar10._8_4_ + auVar10._8_4_;
    auVar236._12_4_ = auVar10._12_4_ + auVar10._12_4_;
    auVar236._16_4_ = auVar10._16_4_ + auVar10._16_4_;
    auVar236._20_4_ = auVar10._20_4_ + auVar10._20_4_;
    auVar236._24_4_ = auVar10._24_4_ + auVar10._24_4_;
    auVar236._28_4_ = auVar10._28_4_ + auVar10._28_4_;
    auVar214 = vsubps_avx(local_700,auVar29);
    local_800._28_4_ = fStack_444;
    local_800._0_28_ =
         ZEXT1628(CONCAT412(fVar242 * fVar242,
                            CONCAT48(fVar241 * fVar241,CONCAT44(fVar213 * fVar213,fVar212 * fVar212)
                                    )));
    local_580 = vsubps_avx(local_2a0,local_800);
    local_720._4_4_ = auVar236._4_4_ * auVar236._4_4_;
    local_720._0_4_ = auVar236._0_4_ * auVar236._0_4_;
    local_720._8_4_ = auVar236._8_4_ * auVar236._8_4_;
    local_720._12_4_ = auVar236._12_4_ * auVar236._12_4_;
    local_720._16_4_ = auVar236._16_4_ * auVar236._16_4_;
    local_720._20_4_ = auVar236._20_4_ * auVar236._20_4_;
    local_720._24_4_ = auVar236._24_4_ * auVar236._24_4_;
    local_720._28_4_ = fVar211;
    fVar190 = local_580._0_4_;
    fVar126 = fVar190 * 4.0;
    fVar208 = local_580._4_4_;
    fVar127 = fVar208 * 4.0;
    fVar209 = local_580._8_4_;
    fStack_878 = fVar209 * 4.0;
    fVar210 = local_580._12_4_;
    fStack_874 = fVar210 * 4.0;
    fVar211 = local_580._16_4_;
    fStack_870 = fVar211 * 4.0;
    fVar212 = local_580._20_4_;
    fStack_86c = fVar212 * 4.0;
    fVar213 = local_580._24_4_;
    fStack_868 = fVar213 * 4.0;
    local_880 = CONCAT44(fVar127,fVar126);
    uStack_864 = 0x40800000;
    auVar30._4_4_ = fVar127 * auVar214._4_4_;
    auVar30._0_4_ = fVar126 * auVar214._0_4_;
    auVar30._8_4_ = fStack_878 * auVar214._8_4_;
    auVar30._12_4_ = fStack_874 * auVar214._12_4_;
    auVar30._16_4_ = fStack_870 * auVar214._16_4_;
    auVar30._20_4_ = fStack_86c * auVar214._20_4_;
    auVar30._24_4_ = fStack_868 * auVar214._24_4_;
    auVar30._28_4_ = 0x40800000;
    auVar10 = vsubps_avx(local_720,auVar30);
    auVar91 = vcmpps_avx(auVar10,ZEXT432(0) << 0x20,5);
    _local_540 = ZEXT1632(auVar8);
    fVar102 = local_580._28_4_;
    if ((((((((auVar91 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar91 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar91 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar91 >> 0x7f,0) == '\0') &&
          (auVar91 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar91 >> 0xbf,0) == '\0') &&
        (auVar91 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar91[0x1f]) {
      auVar262._8_4_ = 0x7f800000;
      auVar262._0_8_ = 0x7f8000007f800000;
      auVar262._12_4_ = 0x7f800000;
      auVar262._16_4_ = 0x7f800000;
      auVar262._20_4_ = 0x7f800000;
      auVar262._24_4_ = 0x7f800000;
      auVar262._28_4_ = 0x7f800000;
      auVar184._8_4_ = 0xff800000;
      auVar184._0_8_ = 0xff800000ff800000;
      auVar184._12_4_ = 0xff800000;
      auVar184._16_4_ = 0xff800000;
      auVar184._20_4_ = 0xff800000;
      auVar184._24_4_ = 0xff800000;
      auVar184._28_4_ = 0xff800000;
    }
    else {
      auVar12 = vsqrtps_avx(auVar10);
      auVar263._0_4_ = fVar190 + fVar190;
      auVar263._4_4_ = fVar208 + fVar208;
      auVar263._8_4_ = fVar209 + fVar209;
      auVar263._12_4_ = fVar210 + fVar210;
      auVar263._16_4_ = fVar211 + fVar211;
      auVar263._20_4_ = fVar212 + fVar212;
      auVar263._24_4_ = fVar213 + fVar213;
      auVar263._28_4_ = fVar102 + fVar102;
      auVar161 = vrcpps_avx(auVar263);
      auVar7 = vcmpps_avx(auVar10,ZEXT832(0) << 0x20,5);
      auVar185._8_4_ = 0x3f800000;
      auVar185._0_8_ = 0x3f8000003f800000;
      auVar185._12_4_ = 0x3f800000;
      auVar185._16_4_ = 0x3f800000;
      auVar185._20_4_ = 0x3f800000;
      auVar185._24_4_ = 0x3f800000;
      auVar185._28_4_ = 0x3f800000;
      auVar8 = vfnmadd213ps_fma(auVar263,auVar161,auVar185);
      auVar8 = vfmadd132ps_fma(ZEXT1632(auVar8),auVar161,auVar161);
      auVar186._0_4_ = (uint)auVar236._0_4_ ^ local_4e0;
      auVar186._4_4_ = (uint)auVar236._4_4_ ^ uStack_4dc;
      auVar186._8_4_ = (uint)auVar236._8_4_ ^ uStack_4d8;
      auVar186._12_4_ = (uint)auVar236._12_4_ ^ uStack_4d4;
      auVar186._16_4_ = (uint)auVar236._16_4_ ^ (uint)fStack_4d0;
      auVar186._20_4_ = (uint)auVar236._20_4_ ^ (uint)fStack_4cc;
      auVar186._24_4_ = (uint)auVar236._24_4_ ^ (uint)fStack_4c8;
      auVar186._28_4_ = (uint)auVar236._28_4_ ^ uStack_4c4;
      auVar11 = vsubps_avx(auVar186,auVar12);
      auVar31._4_4_ = auVar8._4_4_ * auVar11._4_4_;
      auVar31._0_4_ = auVar8._0_4_ * auVar11._0_4_;
      auVar31._8_4_ = auVar8._8_4_ * auVar11._8_4_;
      auVar31._12_4_ = auVar8._12_4_ * auVar11._12_4_;
      auVar31._16_4_ = auVar11._16_4_ * 0.0;
      auVar31._20_4_ = auVar11._20_4_ * 0.0;
      auVar31._24_4_ = auVar11._24_4_ * 0.0;
      auVar31._28_4_ = auVar11._28_4_;
      local_740 = auVar236;
      auVar10 = vsubps_avx(auVar12,auVar236);
      auVar32._4_4_ = auVar8._4_4_ * auVar10._4_4_;
      auVar32._0_4_ = auVar8._0_4_ * auVar10._0_4_;
      auVar32._8_4_ = auVar8._8_4_ * auVar10._8_4_;
      auVar32._12_4_ = auVar8._12_4_ * auVar10._12_4_;
      auVar32._16_4_ = auVar10._16_4_ * 0.0;
      auVar32._20_4_ = auVar10._20_4_ * 0.0;
      auVar32._24_4_ = auVar10._24_4_ * 0.0;
      auVar32._28_4_ = auVar161._28_4_;
      auVar8 = vfmadd213ps_fma(ZEXT1632(auVar87),auVar31,_local_540);
      local_500 = ZEXT1632(CONCAT412(fVar128 * auVar8._12_4_,
                                     CONCAT48(fVar129 * auVar8._8_4_,
                                              CONCAT44(fVar125 * auVar8._4_4_,fVar124 * auVar8._0_4_
                                                      ))));
      auVar54._4_4_ = uStack_6dc;
      auVar54._0_4_ = local_6e0;
      auVar54._8_4_ = uStack_6d8;
      auVar54._12_4_ = uStack_6d4;
      auVar54._16_4_ = uStack_6d0;
      auVar54._20_4_ = uStack_6cc;
      auVar54._24_4_ = uStack_6c8;
      auVar54._28_4_ = uStack_6c4;
      auVar10 = vandps_avx(auVar54,local_800);
      auVar10 = vmaxps_avx(local_380,auVar10);
      auVar33._4_4_ = auVar10._4_4_ * 1.9073486e-06;
      auVar33._0_4_ = auVar10._0_4_ * 1.9073486e-06;
      auVar33._8_4_ = auVar10._8_4_ * 1.9073486e-06;
      auVar33._12_4_ = auVar10._12_4_ * 1.9073486e-06;
      auVar33._16_4_ = auVar10._16_4_ * 1.9073486e-06;
      auVar33._20_4_ = auVar10._20_4_ * 1.9073486e-06;
      auVar33._24_4_ = auVar10._24_4_ * 1.9073486e-06;
      auVar33._28_4_ = auVar10._28_4_;
      auVar10 = vandps_avx(local_580,auVar54);
      auVar10 = vcmpps_avx(auVar10,auVar33,1);
      auVar8 = vfmadd213ps_fma(ZEXT1632(auVar87),auVar32,_local_540);
      auVar264._8_4_ = 0x7f800000;
      auVar264._0_8_ = 0x7f8000007f800000;
      auVar264._12_4_ = 0x7f800000;
      auVar264._16_4_ = 0x7f800000;
      auVar264._20_4_ = 0x7f800000;
      auVar264._24_4_ = 0x7f800000;
      auVar264._28_4_ = 0x7f800000;
      auVar262 = vblendvps_avx(auVar264,auVar31,auVar7);
      _local_520 = ZEXT1628(CONCAT412(auVar8._12_4_ * fVar128,
                                      CONCAT48(auVar8._8_4_ * fVar129,
                                               CONCAT44(auVar8._4_4_ * fVar125,
                                                        auVar8._0_4_ * fVar124))));
      uStack_504 = auVar11._28_4_;
      auVar187._8_4_ = 0xff800000;
      auVar187._0_8_ = 0xff800000ff800000;
      auVar187._12_4_ = 0xff800000;
      auVar187._16_4_ = 0xff800000;
      auVar187._20_4_ = 0xff800000;
      auVar187._24_4_ = 0xff800000;
      auVar187._28_4_ = 0xff800000;
      auVar184 = vblendvps_avx(auVar187,auVar32,auVar7);
      auVar161 = auVar7 & auVar10;
      if ((((((((auVar161 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar161 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar161 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar161 >> 0x7f,0) != '\0') ||
            (auVar161 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar161 >> 0xbf,0) != '\0') ||
          (auVar161 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar161[0x1f] < '\0') {
        auVar91 = vandps_avx(auVar10,auVar7);
        auVar10 = vcmpps_avx(auVar214,ZEXT832(0) << 0x20,2);
        auVar225._8_4_ = 0xff800000;
        auVar225._0_8_ = 0xff800000ff800000;
        auVar225._12_4_ = 0xff800000;
        auVar225._16_4_ = 0xff800000;
        auVar225._20_4_ = 0xff800000;
        auVar225._24_4_ = 0xff800000;
        auVar225._28_4_ = 0xff800000;
        auVar226 = ZEXT3264(auVar225);
        auVar256._8_4_ = 0x7f800000;
        auVar256._0_8_ = 0x7f8000007f800000;
        auVar256._12_4_ = 0x7f800000;
        auVar256._16_4_ = 0x7f800000;
        auVar256._20_4_ = 0x7f800000;
        auVar256._24_4_ = 0x7f800000;
        auVar256._28_4_ = 0x7f800000;
        auVar214 = vblendvps_avx(auVar256,auVar225,auVar10);
        auVar8 = vpackssdw_avx(auVar91._0_16_,auVar91._16_16_);
        auVar161 = vpmovsxwd_avx2(auVar8);
        auVar262 = vblendvps_avx(auVar262,auVar214,auVar161);
        auVar214 = vblendvps_avx(auVar225,auVar256,auVar10);
        auVar184 = vblendvps_avx(auVar184,auVar214,auVar161);
        auVar100._0_8_ = auVar91._0_8_ ^ 0xffffffffffffffff;
        auVar100._8_4_ = auVar91._8_4_ ^ 0xffffffff;
        auVar100._12_4_ = auVar91._12_4_ ^ 0xffffffff;
        auVar100._16_4_ = auVar91._16_4_ ^ 0xffffffff;
        auVar100._20_4_ = auVar91._20_4_ ^ 0xffffffff;
        auVar100._24_4_ = auVar91._24_4_ ^ 0xffffffff;
        auVar100._28_4_ = auVar91._28_4_ ^ 0xffffffff;
        auVar91 = vorps_avx(auVar10,auVar100);
        auVar91 = vandps_avx(auVar7,auVar91);
      }
    }
    auVar214 = local_340 & auVar91;
    local_3c0 = _local_6a0;
    local_880 = uVar66;
    if ((((((((auVar214 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar214 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar214 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar214 >> 0x7f,0) == '\0') &&
          (auVar214 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar214 >> 0xbf,0) == '\0') &&
        (auVar214 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar214[0x1f])
    {
LAB_015d9d6b:
      auVar240 = ZEXT3264(local_3c0);
      auVar249 = ZEXT3264(auVar160);
      auVar265 = ZEXT3264(local_980);
      auVar253 = ZEXT3264(local_9a0);
      auVar258 = ZEXT3264(local_9c0);
      auVar232 = ZEXT3264(local_900);
      auVar224 = local_9e0;
    }
    else {
      local_740 = ZEXT1632(auVar131);
      fVar241 = (ray->super_RayK<1>).org.field_0.m128[3] - (float)local_750._0_4_;
      auVar94._4_4_ = fVar241;
      auVar94._0_4_ = fVar241;
      auVar94._8_4_ = fVar241;
      auVar94._12_4_ = fVar241;
      auVar94._16_4_ = fVar241;
      auVar94._20_4_ = fVar241;
      auVar94._24_4_ = fVar241;
      auVar94._28_4_ = fVar241;
      auVar10 = vmaxps_avx(auVar94,auVar262);
      fVar241 = (ray->super_RayK<1>).tfar - (float)local_750._0_4_;
      auVar201._4_4_ = fVar241;
      auVar201._0_4_ = fVar241;
      auVar201._8_4_ = fVar241;
      auVar201._12_4_ = fVar241;
      auVar201._16_4_ = fVar241;
      auVar201._20_4_ = fVar241;
      auVar201._24_4_ = fVar241;
      auVar201._28_4_ = fVar241;
      auVar7 = vminps_avx(auVar201,auVar184);
      auVar137._0_4_ = local_5e0._0_4_ * fVar168;
      auVar137._4_4_ = local_5e0._4_4_ * fVar169;
      auVar137._8_4_ = local_5e0._8_4_ * fVar145;
      auVar137._12_4_ = local_5e0._12_4_ * fVar167;
      auVar137._16_4_ = local_5e0._16_4_ * fVar170;
      auVar137._20_4_ = local_5e0._20_4_ * fVar171;
      auVar137._24_4_ = local_5e0._24_4_ * fVar172;
      auVar137._28_4_ = 0;
      auVar131 = vfmadd213ps_fma(auVar224,local_8e0,auVar137);
      auVar8 = vfmadd213ps_fma(auVar160,local_7c0,ZEXT1632(auVar131));
      auVar159._0_4_ = local_460 * local_5e0._0_4_;
      auVar159._4_4_ = fStack_45c * local_5e0._4_4_;
      auVar159._8_4_ = fStack_458 * local_5e0._8_4_;
      auVar159._12_4_ = fStack_454 * local_5e0._12_4_;
      auVar159._16_4_ = fStack_450 * local_5e0._16_4_;
      auVar159._20_4_ = fStack_44c * local_5e0._20_4_;
      auVar159._24_4_ = fStack_448 * local_5e0._24_4_;
      auVar159._28_4_ = 0;
      auVar131 = vfmadd231ps_fma(auVar159,_local_6a0,local_8e0);
      auVar176 = vfmadd231ps_fma(ZEXT1632(auVar131),_local_680,local_7c0);
      auVar55._4_4_ = uStack_6dc;
      auVar55._0_4_ = local_6e0;
      auVar55._8_4_ = uStack_6d8;
      auVar55._12_4_ = uStack_6d4;
      auVar55._16_4_ = uStack_6d0;
      auVar55._20_4_ = uStack_6cc;
      auVar55._24_4_ = uStack_6c8;
      auVar55._28_4_ = uStack_6c4;
      auVar214 = vandps_avx(auVar55,ZEXT1632(auVar176));
      auVar202._8_4_ = 0x219392ef;
      auVar202._0_8_ = 0x219392ef219392ef;
      auVar202._12_4_ = 0x219392ef;
      auVar202._16_4_ = 0x219392ef;
      auVar202._20_4_ = 0x219392ef;
      auVar202._24_4_ = 0x219392ef;
      auVar202._28_4_ = 0x219392ef;
      auVar224 = vcmpps_avx(auVar214,auVar202,1);
      auVar214 = vrcpps_avx(ZEXT1632(auVar176));
      auVar223._8_4_ = 0x3f800000;
      auVar223._0_8_ = 0x3f8000003f800000;
      auVar223._12_4_ = 0x3f800000;
      auVar223._16_4_ = 0x3f800000;
      auVar223._20_4_ = 0x3f800000;
      auVar223._24_4_ = 0x3f800000;
      auVar223._28_4_ = 0x3f800000;
      auVar226 = ZEXT3264(auVar223);
      auVar160 = ZEXT1632(auVar176);
      auVar131 = vfnmadd213ps_fma(auVar214,auVar160,auVar223);
      auVar131 = vfmadd132ps_fma(ZEXT1632(auVar131),auVar214,auVar214);
      auVar247._0_4_ = local_4e0 ^ auVar176._0_4_;
      auVar247._4_4_ = uStack_4dc ^ auVar176._4_4_;
      auVar247._8_4_ = uStack_4d8 ^ auVar176._8_4_;
      auVar247._12_4_ = uStack_4d4 ^ auVar176._12_4_;
      auVar247._16_4_ = fStack_4d0;
      auVar247._20_4_ = fStack_4cc;
      auVar247._24_4_ = fStack_4c8;
      auVar247._28_4_ = uStack_4c4;
      auVar34._4_4_ = auVar131._4_4_ * (float)(auVar8._4_4_ ^ uStack_4dc);
      auVar34._0_4_ = auVar131._0_4_ * (float)(auVar8._0_4_ ^ local_4e0);
      auVar34._8_4_ = auVar131._8_4_ * (float)(auVar8._8_4_ ^ uStack_4d8);
      auVar34._12_4_ = auVar131._12_4_ * (float)(auVar8._12_4_ ^ uStack_4d4);
      auVar34._16_4_ = fStack_4d0 * 0.0;
      auVar34._20_4_ = fStack_4cc * 0.0;
      auVar34._24_4_ = fStack_4c8 * 0.0;
      auVar34._28_4_ = uStack_4c4;
      auVar214 = vcmpps_avx(auVar160,auVar247,1);
      auVar214 = vorps_avx(auVar224,auVar214);
      auVar255._8_4_ = 0xff800000;
      auVar255._0_8_ = 0xff800000ff800000;
      auVar255._12_4_ = 0xff800000;
      auVar255._16_4_ = 0xff800000;
      auVar255._20_4_ = 0xff800000;
      auVar255._24_4_ = 0xff800000;
      auVar255._28_4_ = 0xff800000;
      auVar214 = vblendvps_avx(auVar34,auVar255,auVar214);
      auVar10 = vmaxps_avx(auVar10,auVar214);
      auVar214 = vcmpps_avx(auVar160,auVar247,6);
      auVar214 = vorps_avx(auVar224,auVar214);
      auVar160._8_4_ = 0x7f800000;
      auVar160._0_8_ = 0x7f8000007f800000;
      auVar160._12_4_ = 0x7f800000;
      auVar160._16_4_ = 0x7f800000;
      auVar160._20_4_ = 0x7f800000;
      auVar160._24_4_ = 0x7f800000;
      auVar160._28_4_ = 0x7f800000;
      auVar214 = vblendvps_avx(auVar34,auVar160,auVar214);
      auVar7 = vminps_avx(auVar7,auVar214);
      fVar145 = (float)(local_4e0 ^ (uint)local_a20._0_4_);
      fVar167 = (float)(uStack_4dc ^ (uint)local_a20._4_4_);
      fVar168 = (float)(uStack_4d8 ^ (uint)local_a20._8_4_);
      fVar169 = (float)(uStack_4d4 ^ (uint)local_a20._12_4_);
      fVar170 = (float)((uint)fStack_4d0 ^ (uint)local_a20._16_4_);
      fVar171 = (float)((uint)fStack_4cc ^ (uint)local_a20._20_4_);
      fVar172 = (float)((uint)fStack_4c8 ^ (uint)local_a20._24_4_);
      auVar188._0_4_ = local_4e0 ^ (uint)local_820._0_4_;
      auVar188._4_4_ = uStack_4dc ^ (uint)local_820._4_4_;
      auVar188._8_4_ = uStack_4d8 ^ (uint)local_820._8_4_;
      auVar188._12_4_ = uStack_4d4 ^ (uint)local_820._12_4_;
      auVar188._16_4_ = (uint)fStack_4d0 ^ (uint)local_820._16_4_;
      auVar188._20_4_ = (uint)fStack_4cc ^ (uint)local_820._20_4_;
      auVar188._24_4_ = (uint)fStack_4c8 ^ (uint)local_820._24_4_;
      auVar188._28_4_ = uStack_4c4 ^ local_820._28_4_;
      auVar214 = vsubps_avx(ZEXT832(0) << 0x20,local_780);
      auVar224 = vsubps_avx(ZEXT832(0) << 0x20,_local_7a0);
      auVar35._4_4_ = auVar224._4_4_ * fVar167;
      auVar35._0_4_ = auVar224._0_4_ * fVar145;
      auVar35._8_4_ = auVar224._8_4_ * fVar168;
      auVar35._12_4_ = auVar224._12_4_ * fVar169;
      auVar35._16_4_ = auVar224._16_4_ * fVar170;
      auVar35._20_4_ = auVar224._20_4_ * fVar171;
      auVar35._24_4_ = auVar224._24_4_ * fVar172;
      auVar35._28_4_ = auVar224._28_4_;
      auVar131 = vfmadd231ps_fma(auVar35,auVar188,auVar214);
      auVar203._0_4_ = local_4e0 ^ (uint)local_a00._0_4_;
      auVar203._4_4_ = uStack_4dc ^ (uint)local_a00._4_4_;
      auVar203._8_4_ = uStack_4d8 ^ (uint)local_a00._8_4_;
      auVar203._12_4_ = uStack_4d4 ^ (uint)local_a00._12_4_;
      auVar203._16_4_ = (uint)fStack_4d0 ^ (uint)local_a00._16_4_;
      auVar203._20_4_ = (uint)fStack_4cc ^ (uint)local_a00._20_4_;
      auVar203._24_4_ = (uint)fStack_4c8 ^ (uint)local_a00._24_4_;
      auVar203._28_4_ = uStack_4c4 ^ local_a00._28_4_;
      auVar214 = vsubps_avx(ZEXT832(0) << 0x20,auVar139);
      auVar8 = vfmadd231ps_fma(ZEXT1632(auVar131),auVar203,auVar214);
      auVar36._4_4_ = fStack_45c * fVar167;
      auVar36._0_4_ = local_460 * fVar145;
      auVar36._8_4_ = fStack_458 * fVar168;
      auVar36._12_4_ = fStack_454 * fVar169;
      auVar36._16_4_ = fStack_450 * fVar170;
      auVar36._20_4_ = fStack_44c * fVar171;
      auVar36._24_4_ = fStack_448 * fVar172;
      auVar36._28_4_ = uStack_4c4 ^ local_a20._28_4_;
      auVar131 = vfmadd231ps_fma(auVar36,auVar188,_local_6a0);
      auVar176 = vfmadd231ps_fma(ZEXT1632(auVar131),auVar203,_local_680);
      auVar214 = vandps_avx(auVar55,ZEXT1632(auVar176));
      auVar139 = vrcpps_avx(ZEXT1632(auVar176));
      auVar239._8_4_ = 0x219392ef;
      auVar239._0_8_ = 0x219392ef219392ef;
      auVar239._12_4_ = 0x219392ef;
      auVar239._16_4_ = 0x219392ef;
      auVar239._20_4_ = 0x219392ef;
      auVar239._24_4_ = 0x219392ef;
      auVar239._28_4_ = 0x219392ef;
      auVar224 = vcmpps_avx(auVar214,auVar239,1);
      auVar161 = ZEXT1632(auVar176);
      auVar131 = vfnmadd213ps_fma(auVar139,auVar161,auVar223);
      auVar131 = vfmadd132ps_fma(ZEXT1632(auVar131),auVar139,auVar139);
      auVar204._0_4_ = local_4e0 ^ auVar176._0_4_;
      auVar204._4_4_ = uStack_4dc ^ auVar176._4_4_;
      auVar204._8_4_ = uStack_4d8 ^ auVar176._8_4_;
      auVar204._12_4_ = uStack_4d4 ^ auVar176._12_4_;
      auVar204._16_4_ = fStack_4d0;
      auVar204._20_4_ = fStack_4cc;
      auVar204._24_4_ = fStack_4c8;
      auVar204._28_4_ = uStack_4c4;
      auVar37._4_4_ = auVar131._4_4_ * (float)(uStack_4dc ^ auVar8._4_4_);
      auVar37._0_4_ = auVar131._0_4_ * (float)(local_4e0 ^ auVar8._0_4_);
      auVar37._8_4_ = auVar131._8_4_ * (float)(uStack_4d8 ^ auVar8._8_4_);
      auVar37._12_4_ = auVar131._12_4_ * (float)(uStack_4d4 ^ auVar8._12_4_);
      auVar37._16_4_ = fStack_4d0 * 0.0;
      auVar37._20_4_ = fStack_4cc * 0.0;
      auVar37._24_4_ = fStack_4c8 * 0.0;
      auVar37._28_4_ = uStack_4c4;
      auVar214 = vcmpps_avx(auVar161,auVar204,1);
      auVar214 = vorps_avx(auVar214,auVar224);
      auVar214 = vblendvps_avx(auVar37,auVar255,auVar214);
      local_3c0 = vmaxps_avx(auVar10,auVar214);
      auVar214 = vcmpps_avx(auVar161,auVar204,6);
      auVar214 = vorps_avx(auVar224,auVar214);
      auVar214 = vblendvps_avx(auVar37,auVar160,auVar214);
      auVar91 = vandps_avx(auVar91,local_340);
      local_3e0 = vminps_avx(auVar7,auVar214);
      auVar214 = vcmpps_avx(local_3c0,local_3e0,2);
      auVar224 = auVar91 & auVar214;
      if ((((((((auVar224 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar224 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar224 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar224 >> 0x7f,0) == '\0') &&
            (auVar224 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar224 >> 0xbf,0) == '\0') &&
          (auVar224 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar224[0x1f]) goto LAB_015d9d6b;
      auVar205._8_4_ = 0x3f800000;
      auVar205._0_8_ = 0x3f8000003f800000;
      auVar205._12_4_ = 0x3f800000;
      auVar205._16_4_ = 0x3f800000;
      auVar205._20_4_ = 0x3f800000;
      auVar205._24_4_ = 0x3f800000;
      auVar205._28_4_ = 0x3f800000;
      auVar224 = vminps_avx(local_500,auVar205);
      auVar139 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar224 = vmaxps_avx(auVar224,auVar139);
      auVar10 = vminps_avx(_local_520,auVar205);
      auVar10 = vmaxps_avx(auVar10,auVar139);
      auVar38._4_4_ = (auVar224._4_4_ + 1.0) * 0.125;
      auVar38._0_4_ = (auVar224._0_4_ + 0.0) * 0.125;
      auVar38._8_4_ = (auVar224._8_4_ + 2.0) * 0.125;
      auVar38._12_4_ = (auVar224._12_4_ + 3.0) * 0.125;
      auVar38._16_4_ = (auVar224._16_4_ + 4.0) * 0.125;
      auVar38._20_4_ = (auVar224._20_4_ + 5.0) * 0.125;
      auVar38._24_4_ = (auVar224._24_4_ + 6.0) * 0.125;
      auVar38._28_4_ = auVar224._28_4_ + 7.0;
      auVar131 = vfmadd213ps_fma(auVar38,local_620,local_600);
      auVar39._4_4_ = (auVar10._4_4_ + 1.0) * 0.125;
      auVar39._0_4_ = (auVar10._0_4_ + 0.0) * 0.125;
      auVar39._8_4_ = (auVar10._8_4_ + 2.0) * 0.125;
      auVar39._12_4_ = (auVar10._12_4_ + 3.0) * 0.125;
      auVar39._16_4_ = (auVar10._16_4_ + 4.0) * 0.125;
      auVar39._20_4_ = (auVar10._20_4_ + 5.0) * 0.125;
      auVar39._24_4_ = (auVar10._24_4_ + 6.0) * 0.125;
      auVar39._28_4_ = auVar10._28_4_ + 7.0;
      auVar8 = vfmadd213ps_fma(auVar39,local_620,local_600);
      auVar224 = vminps_avx(local_640,local_660);
      auVar10 = vminps_avx(_local_860,_local_6c0);
      auVar224 = vminps_avx(auVar224,auVar10);
      auVar224 = vsubps_avx(auVar224,_local_560);
      auVar91 = vandps_avx(auVar214,auVar91);
      local_1a0 = ZEXT1632(auVar131);
      local_1c0 = ZEXT1632(auVar8);
      auVar40._4_4_ = auVar224._4_4_ * 0.99999976;
      auVar40._0_4_ = auVar224._0_4_ * 0.99999976;
      auVar40._8_4_ = auVar224._8_4_ * 0.99999976;
      auVar40._12_4_ = auVar224._12_4_ * 0.99999976;
      auVar40._16_4_ = auVar224._16_4_ * 0.99999976;
      auVar40._20_4_ = auVar224._20_4_ * 0.99999976;
      auVar40._24_4_ = auVar224._24_4_ * 0.99999976;
      auVar40._28_4_ = 0x3f7ffffc;
      auVar214 = vmaxps_avx(ZEXT832(0) << 0x20,auVar40);
      auVar41._4_4_ = auVar214._4_4_ * auVar214._4_4_;
      auVar41._0_4_ = auVar214._0_4_ * auVar214._0_4_;
      auVar41._8_4_ = auVar214._8_4_ * auVar214._8_4_;
      auVar41._12_4_ = auVar214._12_4_ * auVar214._12_4_;
      auVar41._16_4_ = auVar214._16_4_ * auVar214._16_4_;
      auVar41._20_4_ = auVar214._20_4_ * auVar214._20_4_;
      auVar41._24_4_ = auVar214._24_4_ * auVar214._24_4_;
      auVar41._28_4_ = auVar214._28_4_;
      auVar224 = vsubps_avx(local_700,auVar41);
      auVar42._4_4_ = auVar224._4_4_ * fVar127;
      auVar42._0_4_ = auVar224._0_4_ * fVar126;
      auVar42._8_4_ = auVar224._8_4_ * fStack_878;
      auVar42._12_4_ = auVar224._12_4_ * fStack_874;
      auVar42._16_4_ = auVar224._16_4_ * fStack_870;
      auVar42._20_4_ = auVar224._20_4_ * fStack_86c;
      auVar42._24_4_ = auVar224._24_4_ * fStack_868;
      auVar42._28_4_ = auVar214._28_4_;
      auVar214 = vsubps_avx(local_720,auVar42);
      local_aa0 = vcmpps_avx(auVar214,ZEXT1232(ZEXT812(0)) << 0x20,5);
      _local_860 = local_3c0;
      auVar10 = _local_860;
      if ((((((((local_aa0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (local_aa0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (local_aa0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(local_aa0 >> 0x7f,0) == '\0') &&
            (local_aa0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(local_aa0 >> 0xbf,0) == '\0') &&
          (local_aa0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < local_aa0[0x1f]) {
        auVar53 = ZEXT812(0);
        auVar160 = ZEXT1232(auVar53) << 0x20;
        local_700 = ZEXT1232(auVar53) << 0x20;
        local_720 = ZEXT1232(auVar53) << 0x20;
        _local_560 = ZEXT1232(auVar53) << 0x20;
        auVar162 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar229 = SUB6428(ZEXT864(0),0) << 0x20;
        auVar206._8_4_ = 0x7f800000;
        auVar206._0_8_ = 0x7f8000007f800000;
        auVar206._12_4_ = 0x7f800000;
        auVar206._16_4_ = 0x7f800000;
        auVar206._20_4_ = 0x7f800000;
        auVar206._24_4_ = 0x7f800000;
        auVar206._28_4_ = 0x7f800000;
        auVar215._8_4_ = 0xff800000;
        auVar215._0_8_ = 0xff800000ff800000;
        auVar215._12_4_ = 0xff800000;
        auVar215._16_4_ = 0xff800000;
        auVar215._20_4_ = 0xff800000;
        auVar215._24_4_ = 0xff800000;
        auVar215._28_4_ = 0xff800000;
      }
      else {
        auVar160 = vsqrtps_avx(auVar214);
        auVar163._0_4_ = fVar190 + fVar190;
        auVar163._4_4_ = fVar208 + fVar208;
        auVar163._8_4_ = fVar209 + fVar209;
        auVar163._12_4_ = fVar210 + fVar210;
        auVar163._16_4_ = fVar211 + fVar211;
        auVar163._20_4_ = fVar212 + fVar212;
        auVar163._24_4_ = fVar213 + fVar213;
        auVar163._28_4_ = fVar102 + fVar102;
        auVar139 = vrcpps_avx(auVar163);
        auVar207._8_4_ = 0x3f800000;
        auVar207._0_8_ = 0x3f8000003f800000;
        auVar207._12_4_ = 0x3f800000;
        auVar207._16_4_ = 0x3f800000;
        auVar207._20_4_ = 0x3f800000;
        auVar207._24_4_ = 0x3f800000;
        auVar207._28_4_ = 0x3f800000;
        auVar131 = vfnmadd213ps_fma(auVar163,auVar139,auVar207);
        auVar131 = vfmadd132ps_fma(ZEXT1632(auVar131),auVar139,auVar139);
        auVar189._0_4_ = (uint)auVar236._0_4_ ^ local_4e0;
        auVar189._4_4_ = (uint)auVar236._4_4_ ^ uStack_4dc;
        auVar189._8_4_ = (uint)auVar236._8_4_ ^ uStack_4d8;
        auVar189._12_4_ = (uint)auVar236._12_4_ ^ uStack_4d4;
        auVar189._16_4_ = (uint)auVar236._16_4_ ^ (uint)fStack_4d0;
        auVar189._20_4_ = (uint)auVar236._20_4_ ^ (uint)fStack_4cc;
        auVar189._24_4_ = (uint)auVar236._24_4_ ^ (uint)fStack_4c8;
        auVar189._28_4_ = (uint)auVar236._28_4_ ^ uStack_4c4;
        auVar139 = vsubps_avx(auVar189,auVar160);
        auVar160 = vsubps_avx(auVar160,auVar236);
        fVar102 = auVar139._0_4_ * auVar131._0_4_;
        fVar126 = auVar139._4_4_ * auVar131._4_4_;
        auVar43._4_4_ = fVar126;
        auVar43._0_4_ = fVar102;
        fVar127 = auVar139._8_4_ * auVar131._8_4_;
        auVar43._8_4_ = fVar127;
        fVar190 = auVar139._12_4_ * auVar131._12_4_;
        auVar43._12_4_ = fVar190;
        fVar208 = auVar139._16_4_ * 0.0;
        auVar43._16_4_ = fVar208;
        fVar209 = auVar139._20_4_ * 0.0;
        auVar43._20_4_ = fVar209;
        fVar210 = auVar139._24_4_ * 0.0;
        auVar43._24_4_ = fVar210;
        auVar43._28_4_ = 0x3f800000;
        fVar211 = auVar160._0_4_ * auVar131._0_4_;
        fVar212 = auVar160._4_4_ * auVar131._4_4_;
        auVar44._4_4_ = fVar212;
        auVar44._0_4_ = fVar211;
        fVar213 = auVar160._8_4_ * auVar131._8_4_;
        auVar44._8_4_ = fVar213;
        fVar145 = auVar160._12_4_ * auVar131._12_4_;
        auVar44._12_4_ = fVar145;
        fVar167 = auVar160._16_4_ * 0.0;
        auVar44._16_4_ = fVar167;
        fVar168 = auVar160._20_4_ * 0.0;
        auVar44._20_4_ = fVar168;
        fVar169 = auVar160._24_4_ * 0.0;
        auVar44._24_4_ = fVar169;
        auVar44._28_4_ = fVar101;
        auVar131 = vfmadd213ps_fma(ZEXT1632(auVar87),auVar43,_local_540);
        auVar87 = vfmadd213ps_fma(ZEXT1632(auVar87),auVar44,_local_540);
        auVar45._28_4_ = auVar139._28_4_;
        auVar45._0_28_ =
             ZEXT1628(CONCAT412(fVar128 * auVar131._12_4_,
                                CONCAT48(fVar129 * auVar131._8_4_,
                                         CONCAT44(fVar125 * auVar131._4_4_,fVar124 * auVar131._0_4_)
                                        )));
        auVar139 = ZEXT1632(CONCAT412(auVar87._12_4_ * fVar128,
                                      CONCAT48(auVar87._8_4_ * fVar129,
                                               CONCAT44(auVar87._4_4_ * fVar125,
                                                        auVar87._0_4_ * fVar124))));
        auVar131 = vfmadd213ps_fma(local_4a0,auVar45,local_a40);
        auVar87 = vfmadd213ps_fma(local_4a0,auVar139,local_a40);
        auVar8 = vfmadd213ps_fma(local_4c0,auVar45,auVar162);
        auVar176 = vfmadd213ps_fma(local_4c0,auVar139,auVar162);
        auVar197 = vfmadd213ps_fma(auVar45,local_5a0,local_480);
        auVar9 = vfmadd213ps_fma(local_5a0,auVar139,local_480);
        auVar46._4_4_ = (float)local_680._4_4_ * fVar126;
        auVar46._0_4_ = (float)local_680._0_4_ * fVar102;
        auVar46._8_4_ = fStack_678 * fVar127;
        auVar46._12_4_ = fStack_674 * fVar190;
        auVar46._16_4_ = fStack_670 * fVar208;
        auVar46._20_4_ = fStack_66c * fVar209;
        auVar46._24_4_ = fStack_668 * fVar210;
        auVar46._28_4_ = 0;
        auVar160 = vsubps_avx(auVar46,ZEXT1632(auVar131));
        auVar164._0_4_ = (float)local_6a0._0_4_ * fVar102;
        auVar164._4_4_ = (float)local_6a0._4_4_ * fVar126;
        auVar164._8_4_ = fStack_698 * fVar127;
        auVar164._12_4_ = fStack_694 * fVar190;
        auVar164._16_4_ = fStack_690 * fVar208;
        auVar164._20_4_ = fStack_68c * fVar209;
        auVar164._24_4_ = fStack_688 * fVar210;
        auVar164._28_4_ = 0;
        auVar162 = vsubps_avx(auVar164,ZEXT1632(auVar8));
        auVar216._0_4_ = local_460 * fVar102;
        auVar216._4_4_ = fStack_45c * fVar126;
        auVar216._8_4_ = fStack_458 * fVar127;
        auVar216._12_4_ = fStack_454 * fVar190;
        auVar216._16_4_ = fStack_450 * fVar208;
        auVar216._20_4_ = fStack_44c * fVar209;
        auVar216._24_4_ = fStack_448 * fVar210;
        auVar216._28_4_ = 0;
        auVar7 = vsubps_avx(auVar216,ZEXT1632(auVar197));
        auVar47._4_4_ = fVar212 * (float)local_680._4_4_;
        auVar47._0_4_ = fVar211 * (float)local_680._0_4_;
        auVar47._8_4_ = fVar213 * fStack_678;
        auVar47._12_4_ = fVar145 * fStack_674;
        auVar47._16_4_ = fVar167 * fStack_670;
        auVar47._20_4_ = fVar168 * fStack_66c;
        auVar47._24_4_ = fVar169 * fStack_668;
        auVar47._28_4_ = 0;
        local_700 = vsubps_avx(auVar47,ZEXT1632(auVar87));
        auVar48._4_4_ = (float)local_6a0._4_4_ * fVar212;
        auVar48._0_4_ = (float)local_6a0._0_4_ * fVar211;
        auVar48._8_4_ = fStack_698 * fVar213;
        auVar48._12_4_ = fStack_694 * fVar145;
        auVar48._16_4_ = fStack_690 * fVar167;
        auVar48._20_4_ = fStack_68c * fVar168;
        auVar48._24_4_ = fStack_688 * fVar169;
        auVar48._28_4_ = local_700._28_4_;
        local_720 = vsubps_avx(auVar48,ZEXT1632(auVar176));
        auVar49._4_4_ = fStack_45c * fVar212;
        auVar49._0_4_ = local_460 * fVar211;
        auVar49._8_4_ = fStack_458 * fVar213;
        auVar49._12_4_ = fStack_454 * fVar145;
        auVar49._16_4_ = fStack_450 * fVar167;
        auVar49._20_4_ = fStack_44c * fVar168;
        auVar49._24_4_ = fStack_448 * fVar169;
        auVar49._28_4_ = local_720._28_4_;
        _local_560 = vsubps_avx(auVar49,ZEXT1632(auVar9));
        auVar139 = vcmpps_avx(auVar214,_DAT_01faff00,5);
        auVar217._8_4_ = 0x7f800000;
        auVar217._0_8_ = 0x7f8000007f800000;
        auVar217._12_4_ = 0x7f800000;
        auVar217._16_4_ = 0x7f800000;
        auVar217._20_4_ = 0x7f800000;
        auVar217._24_4_ = 0x7f800000;
        auVar217._28_4_ = 0x7f800000;
        auVar206 = vblendvps_avx(auVar217,auVar43,auVar139);
        auVar56._4_4_ = uStack_6dc;
        auVar56._0_4_ = local_6e0;
        auVar56._8_4_ = uStack_6d8;
        auVar56._12_4_ = uStack_6d4;
        auVar56._16_4_ = uStack_6d0;
        auVar56._20_4_ = uStack_6cc;
        auVar56._24_4_ = uStack_6c8;
        auVar56._28_4_ = uStack_6c4;
        auVar214 = vandps_avx(auVar56,local_800);
        auVar214 = vmaxps_avx(local_380,auVar214);
        auVar50._4_4_ = auVar214._4_4_ * 1.9073486e-06;
        auVar50._0_4_ = auVar214._0_4_ * 1.9073486e-06;
        auVar50._8_4_ = auVar214._8_4_ * 1.9073486e-06;
        auVar50._12_4_ = auVar214._12_4_ * 1.9073486e-06;
        auVar50._16_4_ = auVar214._16_4_ * 1.9073486e-06;
        auVar50._20_4_ = auVar214._20_4_ * 1.9073486e-06;
        auVar50._24_4_ = auVar214._24_4_ * 1.9073486e-06;
        auVar50._28_4_ = auVar214._28_4_;
        auVar214 = vandps_avx(auVar56,local_580);
        auVar214 = vcmpps_avx(auVar214,auVar50,1);
        auVar218._8_4_ = 0xff800000;
        auVar218._0_8_ = 0xff800000ff800000;
        auVar218._12_4_ = 0xff800000;
        auVar218._16_4_ = 0xff800000;
        auVar218._20_4_ = 0xff800000;
        auVar218._24_4_ = 0xff800000;
        auVar218._28_4_ = 0xff800000;
        auVar215 = vblendvps_avx(auVar218,auVar44,auVar139);
        auVar161 = auVar139 & auVar214;
        if ((((((((auVar161 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar161 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar161 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar161 >> 0x7f,0) != '\0') ||
              (auVar161 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar161 >> 0xbf,0) != '\0') ||
            (auVar161 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar161[0x1f] < '\0') {
          auVar214 = vandps_avx(auVar214,auVar139);
          auVar161 = vcmpps_avx(auVar224,ZEXT832(0) << 0x20,2);
          auVar252._8_4_ = 0xff800000;
          auVar252._0_8_ = 0xff800000ff800000;
          auVar252._12_4_ = 0xff800000;
          auVar252._16_4_ = 0xff800000;
          auVar252._20_4_ = 0xff800000;
          auVar252._24_4_ = 0xff800000;
          auVar252._28_4_ = 0xff800000;
          auVar257._8_4_ = 0x7f800000;
          auVar257._0_8_ = 0x7f8000007f800000;
          auVar257._12_4_ = 0x7f800000;
          auVar257._16_4_ = 0x7f800000;
          auVar257._20_4_ = 0x7f800000;
          auVar257._24_4_ = 0x7f800000;
          auVar257._28_4_ = 0x7f800000;
          auVar224 = vblendvps_avx(auVar257,auVar252,auVar161);
          auVar131 = vpackssdw_avx(auVar214._0_16_,auVar214._16_16_);
          auVar12 = vpmovsxwd_avx2(auVar131);
          auVar206 = vblendvps_avx(auVar206,auVar224,auVar12);
          auVar224 = vblendvps_avx(auVar252,auVar257,auVar161);
          auVar215 = vblendvps_avx(auVar215,auVar224,auVar12);
          auVar231._0_8_ = auVar214._0_8_ ^ 0xffffffffffffffff;
          auVar231._8_4_ = auVar214._8_4_ ^ 0xffffffff;
          auVar231._12_4_ = auVar214._12_4_ ^ 0xffffffff;
          auVar231._16_4_ = auVar214._16_4_ ^ 0xffffffff;
          auVar231._20_4_ = auVar214._20_4_ ^ 0xffffffff;
          auVar231._24_4_ = auVar214._24_4_ ^ 0xffffffff;
          auVar231._28_4_ = auVar214._28_4_ ^ 0xffffffff;
          auVar214 = vorps_avx(auVar161,auVar231);
          local_aa0 = vandps_avx(auVar214,auVar139);
        }
        auVar229 = auVar7._0_28_;
      }
      auVar240 = ZEXT3264(local_3c0);
      auVar265 = ZEXT3264(local_980);
      auVar258 = ZEXT3264(local_9c0);
      auVar253 = ZEXT3264(local_9a0);
      auVar226 = ZEXT3264(local_9e0);
      uVar74 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
      auVar237._4_4_ = uVar74;
      auVar237._0_4_ = uVar74;
      auVar237._8_4_ = uVar74;
      auVar237._12_4_ = uVar74;
      auVar237._16_4_ = uVar74;
      auVar237._20_4_ = uVar74;
      auVar237._24_4_ = uVar74;
      auVar237._28_4_ = uVar74;
      uVar74 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
      auVar248._4_4_ = uVar74;
      auVar248._0_4_ = uVar74;
      auVar248._8_4_ = uVar74;
      auVar248._12_4_ = uVar74;
      auVar248._16_4_ = uVar74;
      auVar248._20_4_ = uVar74;
      auVar248._24_4_ = uVar74;
      auVar248._28_4_ = uVar74;
      auVar249 = ZEXT3264(auVar248);
      fVar102 = (ray->super_RayK<1>).dir.field_0.m128[2];
      local_3a0 = vminps_avx(local_3e0,auVar206);
      local_400 = vmaxps_avx(local_3c0,auVar215);
      auVar214 = vcmpps_avx(local_3c0,local_3a0,2);
      local_580 = vandps_avx(auVar214,auVar91);
      auVar214 = vcmpps_avx(local_400,local_3e0,2);
      local_4a0 = vandps_avx(auVar214,auVar91);
      auVar91 = vorps_avx(local_4a0,local_580);
      if ((((((((auVar91 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar91 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar91 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar91 >> 0x7f,0) == '\0') &&
            (auVar91 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar91 >> 0xbf,0) == '\0') &&
          (auVar91 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar91[0x1f])
      {
        auVar232 = ZEXT3264(local_900);
      }
      else {
        local_5a0 = local_400;
        local_4c0._0_8_ = local_aa0._0_8_ ^ 0xffffffffffffffff;
        local_4c0._8_4_ = local_aa0._8_4_ ^ 0xffffffff;
        local_4c0._12_4_ = local_aa0._12_4_ ^ 0xffffffff;
        local_4c0._16_4_ = local_aa0._16_4_ ^ 0xffffffff;
        local_4c0._20_4_ = local_aa0._20_4_ ^ 0xffffffff;
        local_4c0._24_4_ = local_aa0._24_4_ ^ 0xffffffff;
        local_4c0._28_4_ = local_aa0._28_4_ ^ 0xffffffff;
        auVar51._4_4_ = auVar229._4_4_ * fVar102;
        auVar51._0_4_ = auVar229._0_4_ * fVar102;
        auVar51._8_4_ = auVar229._8_4_ * fVar102;
        auVar51._12_4_ = auVar229._12_4_ * fVar102;
        auVar51._16_4_ = auVar229._16_4_ * fVar102;
        auVar51._20_4_ = auVar229._20_4_ * fVar102;
        auVar51._24_4_ = auVar229._24_4_ * fVar102;
        auVar51._28_4_ = local_aa0._28_4_;
        auVar131 = vfmadd213ps_fma(auVar162,auVar248,auVar51);
        auVar131 = vfmadd213ps_fma(auVar160,auVar237,ZEXT1632(auVar131));
        auVar57._4_4_ = uStack_6dc;
        auVar57._0_4_ = local_6e0;
        auVar57._8_4_ = uStack_6d8;
        auVar57._12_4_ = uStack_6d4;
        auVar57._16_4_ = uStack_6d0;
        auVar57._20_4_ = uStack_6cc;
        auVar57._24_4_ = uStack_6c8;
        auVar57._28_4_ = uStack_6c4;
        auVar91 = vandps_avx(ZEXT1632(auVar131),auVar57);
        auVar120._8_4_ = 0x3e99999a;
        auVar120._0_8_ = 0x3e99999a3e99999a;
        auVar120._12_4_ = 0x3e99999a;
        auVar120._16_4_ = 0x3e99999a;
        auVar120._20_4_ = 0x3e99999a;
        auVar120._24_4_ = 0x3e99999a;
        auVar120._28_4_ = 0x3e99999a;
        auVar91 = vcmpps_avx(auVar91,auVar120,1);
        auVar91 = vorps_avx(auVar91,local_4c0);
        auVar121._8_4_ = 3;
        auVar121._0_8_ = 0x300000003;
        auVar121._12_4_ = 3;
        auVar121._16_4_ = 3;
        auVar121._20_4_ = 3;
        auVar121._24_4_ = 3;
        auVar121._28_4_ = 3;
        auVar140._8_4_ = 2;
        auVar140._0_8_ = 0x200000002;
        auVar140._12_4_ = 2;
        auVar140._16_4_ = 2;
        auVar140._20_4_ = 2;
        auVar140._24_4_ = 2;
        auVar140._28_4_ = 2;
        auVar91 = vblendvps_avx(auVar140,auVar121,auVar91);
        local_740._4_4_ = local_acc;
        local_740._0_4_ = local_acc;
        local_740._8_4_ = local_acc;
        local_740._12_4_ = local_acc;
        local_740._16_4_ = local_acc;
        local_740._20_4_ = local_acc;
        local_740._24_4_ = local_acc;
        local_740._28_4_ = local_acc;
        local_480 = vpcmpgtd_avx2(auVar91,local_740);
        local_440 = vpandn_avx2(local_480,local_580);
        auVar122 = ZEXT3264(local_440);
        auVar91 = local_580 & ~local_480;
        local_a20 = auVar14;
        local_a00 = auVar15;
        local_820 = auVar16;
        if ((((((((auVar91 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar91 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar91 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar91 >> 0x7f,0) == '\0') &&
              (auVar91 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar91 >> 0xbf,0) == '\0') &&
            (auVar91 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar91[0x1f]) {
          fVar124 = (ray->super_RayK<1>).tfar;
          auVar97._4_4_ = fVar124;
          auVar97._0_4_ = fVar124;
          auVar97._8_4_ = fVar124;
          auVar97._12_4_ = fVar124;
          auVar97._16_4_ = fVar124;
          auVar97._20_4_ = fVar124;
          auVar97._24_4_ = fVar124;
          auVar97._28_4_ = fVar124;
          auVar232 = ZEXT3264(local_900);
          fVar124 = fVar102;
          fVar125 = fVar102;
          fVar126 = fVar102;
          fVar129 = fVar102;
          fVar127 = fVar102;
          fVar128 = fVar102;
        }
        else {
          local_540._4_4_ = fVar102;
          local_540._0_4_ = fVar102;
          fStack_538 = fVar102;
          fStack_534 = fVar102;
          fStack_530 = fVar102;
          fStack_52c = fVar102;
          fStack_528 = fVar102;
          fStack_524 = fVar102;
          _local_520 = auVar248;
          local_500 = auVar237;
          auVar87 = vminps_avx(local_910,local_930);
          auVar131 = vmaxps_avx(local_910,local_930);
          auVar8 = vminps_avx(local_920,_local_940);
          auVar176 = vminps_avx(auVar87,auVar8);
          auVar87 = vmaxps_avx(local_920,_local_940);
          auVar8 = vmaxps_avx(auVar131,auVar87);
          auVar131 = vandps_avx(auVar176,local_950);
          auVar87 = vandps_avx(auVar8,local_950);
          auVar131 = vmaxps_avx(auVar131,auVar87);
          auVar87 = vmovshdup_avx(auVar131);
          auVar87 = vmaxss_avx(auVar87,auVar131);
          auVar131 = vshufpd_avx(auVar131,auVar131,1);
          auVar131 = vmaxss_avx(auVar131,auVar87);
          local_7c0._0_4_ = auVar131._0_4_ * 1.9073486e-06;
          local_660._0_16_ = vshufps_avx(auVar8,auVar8,0xff);
          local_860._0_4_ = local_3c0._0_4_;
          local_860._4_4_ = local_3c0._4_4_;
          fStack_858 = local_3c0._8_4_;
          fStack_854 = local_3c0._12_4_;
          fStack_850 = local_3c0._16_4_;
          fStack_84c = local_3c0._20_4_;
          fStack_848 = local_3c0._24_4_;
          fStack_844 = local_3c0._28_4_;
          local_6c0._4_4_ = (float)local_860._4_4_ + (float)local_7e0._4_4_;
          local_6c0._0_4_ = (float)local_860._0_4_ + (float)local_7e0._0_4_;
          fStack_6b8 = fStack_858 + fStack_7d8;
          fStack_6b4 = fStack_854 + fStack_7d4;
          fStack_6b0 = fStack_850 + fStack_7d0;
          fStack_6ac = fStack_84c + fStack_7cc;
          fStack_6a8 = fStack_848 + fStack_7c8;
          fStack_6a4 = fStack_844 + fStack_7c4;
          _local_860 = auVar10;
          do {
            auVar98._8_4_ = 0x7f800000;
            auVar98._0_8_ = 0x7f8000007f800000;
            auVar98._12_4_ = 0x7f800000;
            auVar98._16_4_ = 0x7f800000;
            auVar98._20_4_ = 0x7f800000;
            auVar98._24_4_ = 0x7f800000;
            auVar98._28_4_ = 0x7f800000;
            auVar91 = auVar122._0_32_;
            auVar214 = vblendvps_avx(auVar98,_local_860,auVar91);
            auVar224 = vshufps_avx(auVar214,auVar214,0xb1);
            auVar224 = vminps_avx(auVar214,auVar224);
            auVar10 = vshufpd_avx(auVar224,auVar224,5);
            auVar224 = vminps_avx(auVar224,auVar10);
            auVar10 = vpermpd_avx2(auVar224,0x4e);
            auVar224 = vminps_avx(auVar224,auVar10);
            auVar214 = vcmpps_avx(auVar214,auVar224,0);
            auVar224 = auVar91 & auVar214;
            if ((((((((auVar224 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar224 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar224 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar224 >> 0x7f,0) != '\0') ||
                  (auVar224 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar224 >> 0xbf,0) != '\0') ||
                (auVar224 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar224[0x1f] < '\0') {
              auVar91 = vandps_avx(auVar214,auVar91);
            }
            uVar68 = vmovmskps_avx(auVar91);
            iVar13 = 0;
            for (; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x80000000) {
              iVar13 = iVar13 + 1;
            }
            uVar69 = iVar13 << 2;
            *(undefined4 *)(local_440 + uVar69) = 0;
            aVar1 = (ray->super_RayK<1>).dir.field_0;
            local_780._0_16_ = (undefined1  [16])aVar1;
            auVar131 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
            uVar68 = *(uint *)(local_1a0 + uVar69);
            if (auVar131._0_4_ < 0.0) {
              local_a40._0_16_ = ZEXT416(*(uint *)(local_3c0 + uVar69));
              fVar102 = sqrtf(auVar131._0_4_);
              auVar131 = local_a40._0_16_;
            }
            else {
              auVar131 = vsqrtss_avx(auVar131,auVar131);
              fVar102 = auVar131._0_4_;
              auVar131 = ZEXT416(*(uint *)(local_3c0 + uVar69));
            }
            local_800._0_4_ = fVar102 * 1.9073486e-06;
            auVar131 = vinsertps_avx(auVar131,ZEXT416(uVar68),0x10);
            lVar70 = 5;
            do {
              auVar8 = vmovshdup_avx(auVar131);
              fVar129 = 1.0 - auVar8._0_4_;
              local_8e0._0_16_ = ZEXT416((uint)fVar129);
              auVar87 = vshufps_avx(auVar131,auVar131,0x55);
              fVar102 = auVar87._0_4_;
              auVar106._0_4_ = local_930._0_4_ * fVar102;
              fVar124 = auVar87._4_4_;
              auVar106._4_4_ = local_930._4_4_ * fVar124;
              fVar125 = auVar87._8_4_;
              auVar106._8_4_ = local_930._8_4_ * fVar125;
              fVar126 = auVar87._12_4_;
              auVar106._12_4_ = local_930._12_4_ * fVar126;
              auVar132._4_4_ = fVar129;
              auVar132._0_4_ = fVar129;
              auVar132._8_4_ = fVar129;
              auVar132._12_4_ = fVar129;
              auVar87 = vfmadd231ps_fma(auVar106,auVar132,local_910);
              auVar147._0_4_ = local_920._0_4_ * fVar102;
              auVar147._4_4_ = local_920._4_4_ * fVar124;
              auVar147._8_4_ = local_920._8_4_ * fVar125;
              auVar147._12_4_ = local_920._12_4_ * fVar126;
              auVar176 = vfmadd231ps_fma(auVar147,auVar132,local_930);
              auVar196._0_4_ = fVar102 * auVar176._0_4_;
              auVar196._4_4_ = fVar124 * auVar176._4_4_;
              auVar196._8_4_ = fVar125 * auVar176._8_4_;
              auVar196._12_4_ = fVar126 * auVar176._12_4_;
              auVar197 = vfmadd231ps_fma(auVar196,auVar132,auVar87);
              auVar107._0_4_ = fVar102 * (float)local_940._0_4_;
              auVar107._4_4_ = fVar124 * (float)local_940._4_4_;
              auVar107._8_4_ = fVar125 * fStack_938;
              auVar107._12_4_ = fVar126 * fStack_934;
              auVar87 = vfmadd231ps_fma(auVar107,auVar132,local_920);
              auVar175._0_4_ = fVar102 * auVar87._0_4_;
              auVar175._4_4_ = fVar124 * auVar87._4_4_;
              auVar175._8_4_ = fVar125 * auVar87._8_4_;
              auVar175._12_4_ = fVar126 * auVar87._12_4_;
              auVar176 = vfmadd231ps_fma(auVar175,auVar132,auVar176);
              fVar127 = auVar131._0_4_;
              auVar108._4_4_ = fVar127;
              auVar108._0_4_ = fVar127;
              auVar108._8_4_ = fVar127;
              auVar108._12_4_ = fVar127;
              auVar87 = vfmadd213ps_fma(auVar108,local_780._0_16_,_DAT_01f7aa10);
              auVar83._0_4_ = fVar102 * auVar176._0_4_;
              auVar83._4_4_ = fVar124 * auVar176._4_4_;
              auVar83._8_4_ = fVar125 * auVar176._8_4_;
              auVar83._12_4_ = fVar126 * auVar176._12_4_;
              auVar9 = vfmadd231ps_fma(auVar83,auVar197,auVar132);
              local_5e0._0_16_ = auVar9;
              auVar87 = vsubps_avx(auVar87,auVar9);
              _local_7a0 = auVar87;
              auVar87 = vdpps_avx(auVar87,auVar87,0x7f);
              local_a40._0_16_ = auVar87;
              if (auVar87._0_4_ < 0.0) {
                local_8e0._0_16_ = ZEXT416((uint)fVar129);
                local_a00._0_16_ = auVar197;
                local_a20._0_16_ = auVar176;
                auVar253._0_4_ = sqrtf(auVar87._0_4_);
                auVar253._4_60_ = extraout_var;
                auVar87 = auVar253._0_16_;
                auVar176 = local_a20._0_16_;
                auVar197 = local_a00._0_16_;
              }
              else {
                auVar87 = vsqrtss_avx(auVar87,auVar87);
              }
              auVar176 = vsubps_avx(auVar176,auVar197);
              auVar220._0_4_ = auVar176._0_4_ * 3.0;
              auVar220._4_4_ = auVar176._4_4_ * 3.0;
              auVar220._8_4_ = auVar176._8_4_ * 3.0;
              auVar220._12_4_ = auVar176._12_4_ * 3.0;
              auVar176 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_8e0._0_16_,auVar8);
              auVar197 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar8,local_8e0._0_16_);
              fVar102 = local_8e0._0_4_ * 6.0;
              fVar124 = auVar176._0_4_ * 6.0;
              fVar125 = auVar197._0_4_ * 6.0;
              fVar126 = auVar8._0_4_ * 6.0;
              auVar148._0_4_ = fVar126 * (float)local_940._0_4_;
              auVar148._4_4_ = fVar126 * (float)local_940._4_4_;
              auVar148._8_4_ = fVar126 * fStack_938;
              auVar148._12_4_ = fVar126 * fStack_934;
              auVar109._4_4_ = fVar125;
              auVar109._0_4_ = fVar125;
              auVar109._8_4_ = fVar125;
              auVar109._12_4_ = fVar125;
              auVar8 = vfmadd132ps_fma(auVar109,auVar148,local_920);
              auVar149._4_4_ = fVar124;
              auVar149._0_4_ = fVar124;
              auVar149._8_4_ = fVar124;
              auVar149._12_4_ = fVar124;
              auVar8 = vfmadd132ps_fma(auVar149,auVar8,local_930);
              auVar176 = vdpps_avx(auVar220,auVar220,0x7f);
              auVar110._4_4_ = fVar102;
              auVar110._0_4_ = fVar102;
              auVar110._8_4_ = fVar102;
              auVar110._12_4_ = fVar102;
              auVar9 = vfmadd132ps_fma(auVar110,auVar8,local_910);
              auVar8 = vblendps_avx(auVar176,_DAT_01f7aa10,0xe);
              auVar197 = vrsqrtss_avx(auVar8,auVar8);
              fVar125 = auVar176._0_4_;
              fVar102 = auVar197._0_4_;
              auVar197 = vdpps_avx(auVar220,auVar9,0x7f);
              fVar102 = fVar102 * 1.5 + fVar125 * -0.5 * fVar102 * fVar102 * fVar102;
              auVar111._0_4_ = auVar9._0_4_ * fVar125;
              auVar111._4_4_ = auVar9._4_4_ * fVar125;
              auVar111._8_4_ = auVar9._8_4_ * fVar125;
              auVar111._12_4_ = auVar9._12_4_ * fVar125;
              fVar124 = auVar197._0_4_;
              auVar198._0_4_ = auVar220._0_4_ * fVar124;
              auVar198._4_4_ = auVar220._4_4_ * fVar124;
              auVar198._8_4_ = auVar220._8_4_ * fVar124;
              auVar198._12_4_ = auVar220._12_4_ * fVar124;
              auVar197 = vsubps_avx(auVar111,auVar198);
              auVar8 = vrcpss_avx(auVar8,auVar8);
              auVar9 = vfnmadd213ss_fma(auVar8,auVar176,ZEXT416(0x40000000));
              fVar124 = auVar8._0_4_ * auVar9._0_4_;
              auVar8 = vmaxss_avx(ZEXT416((uint)local_7c0._0_4_),
                                  ZEXT416((uint)(fVar127 * (float)local_800._0_4_)));
              uVar66 = CONCAT44(auVar220._4_4_,auVar220._0_4_);
              auVar234._0_8_ = uVar66 ^ 0x8000000080000000;
              auVar234._8_4_ = -auVar220._8_4_;
              auVar234._12_4_ = -auVar220._12_4_;
              local_840._0_4_ = fVar102 * auVar197._0_4_ * fVar124;
              local_840._4_4_ = fVar102 * auVar197._4_4_ * fVar124;
              local_840._8_4_ = fVar102 * auVar197._8_4_ * fVar124;
              local_840._12_4_ = fVar102 * auVar197._12_4_ * fVar124;
              local_820._0_4_ = auVar220._0_4_ * fVar102;
              local_820._4_4_ = auVar220._4_4_ * fVar102;
              local_820._8_4_ = auVar220._8_4_ * fVar102;
              local_820._12_4_ = auVar220._12_4_ * fVar102;
              local_8e0._0_16_ = auVar220;
              if (fVar125 < -fVar125) {
                local_a00._0_4_ = auVar87._0_4_;
                local_a20._0_16_ = auVar234;
                fVar102 = sqrtf(fVar125);
                auVar87 = ZEXT416((uint)local_a00._0_4_);
                auVar234 = local_a20._0_16_;
                auVar176 = local_820._0_16_;
              }
              else {
                auVar176 = vsqrtss_avx(auVar176,auVar176);
                fVar102 = auVar176._0_4_;
                auVar176 = local_820._0_16_;
              }
              auVar240 = ZEXT1664(auVar176);
              local_a00._0_16_ = vdpps_avx(_local_7a0,auVar176,0x7f);
              auVar78 = vfmadd213ss_fma(ZEXT416((uint)local_7c0._0_4_),auVar87,
                                        ZEXT416((uint)auVar8._0_4_));
              auVar197 = vdpps_avx(auVar234,auVar176,0x7f);
              auVar9 = vdpps_avx(_local_7a0,local_840._0_16_,0x7f);
              auVar79 = vdpps_avx(local_780._0_16_,auVar176,0x7f);
              auVar87 = vfmadd213ss_fma(ZEXT416((uint)(auVar87._0_4_ + 1.0)),
                                        ZEXT416((uint)((float)local_7c0._0_4_ / fVar102)),auVar78);
              local_a20._0_4_ = auVar87._0_4_;
              auVar84._0_4_ = local_a00._0_4_ * local_a00._0_4_;
              auVar84._4_4_ = local_a00._4_4_ * local_a00._4_4_;
              auVar84._8_4_ = local_a00._8_4_ * local_a00._8_4_;
              auVar84._12_4_ = local_a00._12_4_ * local_a00._12_4_;
              auVar87 = vdpps_avx(_local_7a0,auVar234,0x7f);
              auVar130 = vsubps_avx(local_a40._0_16_,auVar84);
              auVar78 = vrsqrtss_avx(auVar130,auVar130);
              fVar124 = auVar130._0_4_;
              fVar102 = auVar78._0_4_;
              fVar102 = fVar102 * 1.5 + fVar124 * -0.5 * fVar102 * fVar102 * fVar102;
              auVar78 = vdpps_avx(_local_7a0,local_780._0_16_,0x7f);
              local_820._0_16_ = ZEXT416((uint)(auVar197._0_4_ + auVar9._0_4_));
              local_840._0_16_ = vfnmadd231ss_fma(auVar87,local_a00._0_16_,local_820._0_16_);
              auVar87 = vfnmadd231ss_fma(auVar78,local_a00._0_16_,auVar79);
              if (fVar124 < 0.0) {
                local_600._0_16_ = auVar79;
                local_620._0_4_ = fVar102;
                local_640._0_16_ = auVar87;
                auVar240 = ZEXT1664(auVar176);
                fVar124 = sqrtf(fVar124);
                fVar102 = (float)local_620._0_4_;
                auVar87 = local_640._0_16_;
                auVar79 = local_600._0_16_;
              }
              else {
                auVar176 = vsqrtss_avx(auVar130,auVar130);
                fVar124 = auVar176._0_4_;
              }
              auVar253 = ZEXT3264(local_9a0);
              auVar258 = ZEXT3264(local_9c0);
              auVar226 = ZEXT3264(local_9e0);
              auVar232 = ZEXT3264(local_900);
              auVar176 = vpermilps_avx(local_5e0._0_16_,0xff);
              fVar124 = fVar124 - auVar176._0_4_;
              auVar197 = vshufps_avx(local_8e0._0_16_,local_8e0._0_16_,0xff);
              auVar176 = vfmsub213ss_fma(local_840._0_16_,ZEXT416((uint)fVar102),auVar197);
              auVar150._0_8_ = auVar79._0_8_ ^ 0x8000000080000000;
              auVar150._8_4_ = auVar79._8_4_ ^ 0x80000000;
              auVar150._12_4_ = auVar79._12_4_ ^ 0x80000000;
              auVar177._0_8_ = auVar176._0_8_ ^ 0x8000000080000000;
              auVar177._8_4_ = auVar176._8_4_ ^ 0x80000000;
              auVar177._12_4_ = auVar176._12_4_ ^ 0x80000000;
              auVar87 = ZEXT416((uint)(auVar87._0_4_ * fVar102));
              auVar176 = vfmsub231ss_fma(ZEXT416((uint)(auVar79._0_4_ * auVar176._0_4_)),
                                         local_820._0_16_,auVar87);
              auVar87 = vinsertps_avx(auVar177,auVar87,0x1c);
              uVar74 = auVar176._0_4_;
              auVar178._4_4_ = uVar74;
              auVar178._0_4_ = uVar74;
              auVar178._8_4_ = uVar74;
              auVar178._12_4_ = uVar74;
              auVar87 = vdivps_avx(auVar87,auVar178);
              auVar176 = vinsertps_avx(local_820._0_16_,auVar150,0x10);
              auVar176 = vdivps_avx(auVar176,auVar178);
              fVar102 = local_a00._0_4_;
              auVar133._0_4_ = fVar102 * auVar87._0_4_ + fVar124 * auVar176._0_4_;
              auVar133._4_4_ = fVar102 * auVar87._4_4_ + fVar124 * auVar176._4_4_;
              auVar133._8_4_ = fVar102 * auVar87._8_4_ + fVar124 * auVar176._8_4_;
              auVar133._12_4_ = fVar102 * auVar87._12_4_ + fVar124 * auVar176._12_4_;
              auVar131 = vsubps_avx(auVar131,auVar133);
              auVar87 = vandps_avx(local_a00._0_16_,local_950);
              if (auVar87._0_4_ < (float)local_a20._0_4_) {
                auVar8 = vfmadd231ss_fma(ZEXT416((uint)((float)local_a20._0_4_ + auVar8._0_4_)),
                                         local_660._0_16_,ZEXT416(0x36000000));
                auVar87 = vandps_avx(ZEXT416((uint)fVar124),local_950);
                if (auVar87._0_4_ < auVar8._0_4_) {
                  fVar102 = auVar131._0_4_ + (float)local_750._0_4_;
                  auVar265 = ZEXT3264(local_980);
                  if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar102) &&
                     (fVar124 = (ray->super_RayK<1>).tfar, fVar102 <= fVar124)) {
                    auVar131 = vmovshdup_avx(auVar131);
                    fVar125 = auVar131._0_4_;
                    if ((0.0 <= fVar125) && (fVar125 <= 1.0)) {
                      auVar131 = vrsqrtss_avx(local_a40._0_16_,local_a40._0_16_);
                      fVar126 = auVar131._0_4_;
                      pGVar4 = (context->scene->geometries).items[uVar71].ptr;
                      if ((pGVar4->mask & (ray->super_RayK<1>).mask) != 0) {
                        fVar126 = fVar126 * 1.5 +
                                  local_a40._0_4_ * -0.5 * fVar126 * fVar126 * fVar126;
                        auVar151._0_4_ = fVar126 * (float)local_7a0._0_4_;
                        auVar151._4_4_ = fVar126 * (float)local_7a0._4_4_;
                        auVar151._8_4_ = fVar126 * fStack_798;
                        auVar151._12_4_ = fVar126 * fStack_794;
                        auVar176 = vfmadd213ps_fma(auVar197,auVar151,local_8e0._0_16_);
                        auVar131 = vshufps_avx(auVar151,auVar151,0xc9);
                        auVar87 = vshufps_avx(local_8e0._0_16_,local_8e0._0_16_,0xc9);
                        auVar152._0_4_ = auVar151._0_4_ * auVar87._0_4_;
                        auVar152._4_4_ = auVar151._4_4_ * auVar87._4_4_;
                        auVar152._8_4_ = auVar151._8_4_ * auVar87._8_4_;
                        auVar152._12_4_ = auVar151._12_4_ * auVar87._12_4_;
                        auVar8 = vfmsub231ps_fma(auVar152,local_8e0._0_16_,auVar131);
                        auVar131 = vshufps_avx(auVar8,auVar8,0xc9);
                        auVar87 = vshufps_avx(auVar176,auVar176,0xc9);
                        auVar8 = vshufps_avx(auVar8,auVar8,0xd2);
                        auVar85._0_4_ = auVar176._0_4_ * auVar8._0_4_;
                        auVar85._4_4_ = auVar176._4_4_ * auVar8._4_4_;
                        auVar85._8_4_ = auVar176._8_4_ * auVar8._8_4_;
                        auVar85._12_4_ = auVar176._12_4_ * auVar8._12_4_;
                        auVar131 = vfmsub231ps_fma(auVar85,auVar131,auVar87);
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          (ray->super_RayK<1>).tfar = fVar102;
                          auVar87 = vshufps_avx(auVar131,auVar131,0xe9);
                          uVar75 = vmovlps_avx(auVar87);
                          *(undefined8 *)&(ray->Ng).field_0 = uVar75;
                          (ray->Ng).field_0.field_0.z = auVar131._0_4_;
                          ray->u = fVar125;
                          ray->v = 0.0;
                          ray->primID = (uint)local_880;
                          ray->geomID = uVar71;
                          ray->instID[0] = context->user->instID[0];
                          ray->instPrimID[0] = context->user->instPrimID[0];
                        }
                        else {
                          auVar87 = vshufps_avx(auVar131,auVar131,0xe9);
                          local_8b0 = vmovlps_avx(auVar87);
                          local_8a8 = auVar131._0_4_;
                          local_8a4 = fVar125;
                          local_8a0 = 0;
                          local_89c = (uint)local_880;
                          local_898 = uVar71;
                          local_894 = context->user->instID[0];
                          local_890 = context->user->instPrimID[0];
                          (ray->super_RayK<1>).tfar = fVar102;
                          local_5c0._0_4_ = 0xffffffff;
                          local_a78.valid = (int *)local_5c0;
                          local_a78.geometryUserPtr = pGVar4->userPtr;
                          local_a78.context = context->user;
                          local_a78.hit = (RTCHitN *)&local_8b0;
                          local_a78.N = 1;
                          local_a78.ray = (RTCRayN *)ray;
                          if (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_015dabf6:
                            p_Var6 = context->args->filter;
                            if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                              auVar240 = ZEXT1664(auVar240._0_16_);
                              (*p_Var6)(&local_a78);
                              if (*local_a78.valid == 0) goto LAB_015dac84;
                            }
                            (((Vec3f *)((long)local_a78.ray + 0x30))->field_0).components[0] =
                                 *(float *)local_a78.hit;
                            (((Vec3f *)((long)local_a78.ray + 0x30))->field_0).field_0.y =
                                 *(float *)(local_a78.hit + 4);
                            (((Vec3f *)((long)local_a78.ray + 0x30))->field_0).field_0.z =
                                 *(float *)(local_a78.hit + 8);
                            *(float *)((long)local_a78.ray + 0x3c) = *(float *)(local_a78.hit + 0xc)
                            ;
                            *(float *)((long)local_a78.ray + 0x40) =
                                 *(float *)(local_a78.hit + 0x10);
                            *(float *)((long)local_a78.ray + 0x44) =
                                 *(float *)(local_a78.hit + 0x14);
                            *(float *)((long)local_a78.ray + 0x48) =
                                 *(float *)(local_a78.hit + 0x18);
                            *(float *)((long)local_a78.ray + 0x4c) =
                                 *(float *)(local_a78.hit + 0x1c);
                            *(float *)((long)local_a78.ray + 0x50) =
                                 *(float *)(local_a78.hit + 0x20);
                          }
                          else {
                            auVar240 = ZEXT1664(auVar240._0_16_);
                            (*pGVar4->intersectionFilterN)(&local_a78);
                            if (*local_a78.valid != 0) goto LAB_015dabf6;
LAB_015dac84:
                            (ray->super_RayK<1>).tfar = fVar124;
                          }
                          auVar265 = ZEXT3264(local_980);
                          auVar253 = ZEXT3264(local_9a0);
                          auVar258 = ZEXT3264(local_9c0);
                          auVar226 = ZEXT3264(local_9e0);
                          auVar232 = ZEXT3264(local_900);
                        }
                      }
                    }
                  }
                  break;
                }
              }
              lVar70 = lVar70 + -1;
              auVar265 = ZEXT3264(local_980);
            } while (lVar70 != 0);
            auVar214 = local_440;
            fVar102 = (ray->super_RayK<1>).tfar;
            auVar97._4_4_ = fVar102;
            auVar97._0_4_ = fVar102;
            auVar97._8_4_ = fVar102;
            auVar97._12_4_ = fVar102;
            auVar97._16_4_ = fVar102;
            auVar97._20_4_ = fVar102;
            auVar97._24_4_ = fVar102;
            auVar97._28_4_ = fVar102;
            auVar91 = vcmpps_avx(_local_6c0,auVar97,2);
            local_440 = vandps_avx(auVar91,local_440);
            auVar122 = ZEXT3264(local_440);
            auVar214 = auVar214 & auVar91;
          } while ((((((((auVar214 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (auVar214 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar214 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(auVar214 >> 0x7f,0) != '\0') ||
                     (auVar214 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(auVar214 >> 0xbf,0) != '\0') ||
                   (auVar214 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   auVar214[0x1f] < '\0');
          auVar249 = ZEXT3264(_local_520);
          auVar237 = local_500;
          fVar102 = (float)local_540._0_4_;
          fVar124 = (float)local_540._4_4_;
          fVar125 = fStack_538;
          fVar126 = fStack_534;
          fVar129 = fStack_530;
          fVar127 = fStack_52c;
          fVar128 = fStack_528;
        }
        auVar123._0_4_ = fVar102 * (float)local_560._0_4_;
        auVar123._4_4_ = fVar124 * (float)local_560._4_4_;
        auVar123._8_4_ = fVar125 * fStack_558;
        auVar123._12_4_ = fVar126 * fStack_554;
        auVar123._16_4_ = fVar129 * fStack_550;
        auVar123._20_4_ = fVar127 * fStack_54c;
        auVar123._28_36_ = auVar122._28_36_;
        auVar123._24_4_ = fVar128 * fStack_548;
        auVar131 = vfmadd213ps_fma(local_720,auVar249._0_32_,auVar123._0_32_);
        auVar131 = vfmadd213ps_fma(local_700,auVar237,ZEXT1632(auVar131));
        auVar58._4_4_ = uStack_6dc;
        auVar58._0_4_ = local_6e0;
        auVar58._8_4_ = uStack_6d8;
        auVar58._12_4_ = uStack_6d4;
        auVar58._16_4_ = uStack_6d0;
        auVar58._20_4_ = uStack_6cc;
        auVar58._24_4_ = uStack_6c8;
        auVar58._28_4_ = uStack_6c4;
        auVar91 = vandps_avx(ZEXT1632(auVar131),auVar58);
        auVar141._8_4_ = 0x3e99999a;
        auVar141._0_8_ = 0x3e99999a3e99999a;
        auVar141._12_4_ = 0x3e99999a;
        auVar141._16_4_ = 0x3e99999a;
        auVar141._20_4_ = 0x3e99999a;
        auVar141._24_4_ = 0x3e99999a;
        auVar141._28_4_ = 0x3e99999a;
        auVar91 = vcmpps_avx(auVar91,auVar141,1);
        auVar214 = vorps_avx(auVar91,local_4c0);
        auVar142._0_4_ = (float)local_7e0._0_4_ + local_5a0._0_4_;
        auVar142._4_4_ = (float)local_7e0._4_4_ + local_5a0._4_4_;
        auVar142._8_4_ = fStack_7d8 + local_5a0._8_4_;
        auVar142._12_4_ = fStack_7d4 + local_5a0._12_4_;
        auVar142._16_4_ = fStack_7d0 + local_5a0._16_4_;
        auVar142._20_4_ = fStack_7cc + local_5a0._20_4_;
        auVar142._24_4_ = fStack_7c8 + local_5a0._24_4_;
        auVar142._28_4_ = fStack_7c4 + local_5a0._28_4_;
        auVar91 = vcmpps_avx(auVar142,auVar97,2);
        local_720 = vandps_avx(auVar91,local_4a0);
        auVar143._8_4_ = 3;
        auVar143._0_8_ = 0x300000003;
        auVar143._12_4_ = 3;
        auVar143._16_4_ = 3;
        auVar143._20_4_ = 3;
        auVar143._24_4_ = 3;
        auVar143._28_4_ = 3;
        auVar165._8_4_ = 2;
        auVar165._0_8_ = 0x200000002;
        auVar165._12_4_ = 2;
        auVar165._16_4_ = 2;
        auVar165._20_4_ = 2;
        auVar165._24_4_ = 2;
        auVar165._28_4_ = 2;
        auVar91 = vblendvps_avx(auVar165,auVar143,auVar214);
        local_700 = vpcmpgtd_avx2(auVar91,local_740);
        local_5c0 = vpandn_avx2(local_700,local_720);
        auVar91 = local_720 & ~local_700;
        if ((((((((auVar91 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar91 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar91 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar91 >> 0x7f,0) != '\0') ||
              (auVar91 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar91 >> 0xbf,0) != '\0') ||
            (auVar91 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar91[0x1f] < '\0') {
          auVar87 = vminps_avx(local_910,local_930);
          auVar131 = vmaxps_avx(local_910,local_930);
          _local_860 = local_400;
          auVar8 = vminps_avx(local_920,_local_940);
          auVar176 = vminps_avx(auVar87,auVar8);
          auVar87 = vmaxps_avx(local_920,_local_940);
          auVar8 = vmaxps_avx(auVar131,auVar87);
          auVar131 = vandps_avx(auVar176,local_950);
          auVar87 = vandps_avx(auVar8,local_950);
          auVar131 = vmaxps_avx(auVar131,auVar87);
          auVar87 = vmovshdup_avx(auVar131);
          auVar87 = vmaxss_avx(auVar87,auVar131);
          auVar131 = vshufpd_avx(auVar131,auVar131,1);
          auVar131 = vmaxss_avx(auVar131,auVar87);
          local_7c0._0_4_ = auVar131._0_4_ * 1.9073486e-06;
          local_660._0_16_ = vshufps_avx(auVar8,auVar8,0xff);
          local_6c0._4_4_ = (float)local_7e0._4_4_ + local_400._4_4_;
          local_6c0._0_4_ = (float)local_7e0._0_4_ + local_400._0_4_;
          fStack_6b8 = fStack_7d8 + local_400._8_4_;
          fStack_6b4 = fStack_7d4 + local_400._12_4_;
          fStack_6b0 = fStack_7d0 + local_400._16_4_;
          fStack_6ac = fStack_7cc + local_400._20_4_;
          fStack_6a8 = fStack_7c8 + local_400._24_4_;
          fStack_6a4 = fStack_7c4 + local_400._28_4_;
          do {
            auVar99._8_4_ = 0x7f800000;
            auVar99._0_8_ = 0x7f8000007f800000;
            auVar99._12_4_ = 0x7f800000;
            auVar99._16_4_ = 0x7f800000;
            auVar99._20_4_ = 0x7f800000;
            auVar99._24_4_ = 0x7f800000;
            auVar99._28_4_ = 0x7f800000;
            auVar91 = vblendvps_avx(auVar99,_local_860,local_5c0);
            auVar214 = vshufps_avx(auVar91,auVar91,0xb1);
            auVar214 = vminps_avx(auVar91,auVar214);
            auVar224 = vshufpd_avx(auVar214,auVar214,5);
            auVar214 = vminps_avx(auVar214,auVar224);
            auVar224 = vpermpd_avx2(auVar214,0x4e);
            auVar214 = vminps_avx(auVar214,auVar224);
            auVar214 = vcmpps_avx(auVar91,auVar214,0);
            auVar224 = local_5c0 & auVar214;
            auVar91 = local_5c0;
            if ((((((((auVar224 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar224 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar224 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar224 >> 0x7f,0) != '\0') ||
                  (auVar224 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar224 >> 0xbf,0) != '\0') ||
                (auVar224 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar224[0x1f] < '\0') {
              auVar91 = vandps_avx(auVar214,local_5c0);
            }
            uVar68 = vmovmskps_avx(auVar91);
            iVar13 = 0;
            for (; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x80000000) {
              iVar13 = iVar13 + 1;
            }
            uVar69 = iVar13 << 2;
            *(undefined4 *)(local_5c0 + uVar69) = 0;
            aVar1 = (ray->super_RayK<1>).dir.field_0;
            local_780._0_16_ = (undefined1  [16])aVar1;
            auVar131 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
            uVar68 = *(uint *)(local_1c0 + uVar69);
            if (auVar131._0_4_ < 0.0) {
              local_a40._0_16_ = ZEXT416(*(uint *)(local_3e0 + uVar69));
              fVar102 = sqrtf(auVar131._0_4_);
              auVar131 = local_a40._0_16_;
            }
            else {
              auVar131 = vsqrtss_avx(auVar131,auVar131);
              fVar102 = auVar131._0_4_;
              auVar131 = ZEXT416(*(uint *)(local_3e0 + uVar69));
            }
            local_800._0_4_ = fVar102 * 1.9073486e-06;
            auVar131 = vinsertps_avx(auVar131,ZEXT416(uVar68),0x10);
            lVar70 = 5;
            do {
              auVar8 = vmovshdup_avx(auVar131);
              fVar129 = 1.0 - auVar8._0_4_;
              local_8e0._0_16_ = ZEXT416((uint)fVar129);
              auVar87 = vshufps_avx(auVar131,auVar131,0x55);
              fVar102 = auVar87._0_4_;
              auVar112._0_4_ = local_930._0_4_ * fVar102;
              fVar124 = auVar87._4_4_;
              auVar112._4_4_ = local_930._4_4_ * fVar124;
              fVar125 = auVar87._8_4_;
              auVar112._8_4_ = local_930._8_4_ * fVar125;
              fVar126 = auVar87._12_4_;
              auVar112._12_4_ = local_930._12_4_ * fVar126;
              auVar134._4_4_ = fVar129;
              auVar134._0_4_ = fVar129;
              auVar134._8_4_ = fVar129;
              auVar134._12_4_ = fVar129;
              auVar87 = vfmadd231ps_fma(auVar112,auVar134,local_910);
              auVar153._0_4_ = local_920._0_4_ * fVar102;
              auVar153._4_4_ = local_920._4_4_ * fVar124;
              auVar153._8_4_ = local_920._8_4_ * fVar125;
              auVar153._12_4_ = local_920._12_4_ * fVar126;
              auVar176 = vfmadd231ps_fma(auVar153,auVar134,local_930);
              auVar199._0_4_ = fVar102 * auVar176._0_4_;
              auVar199._4_4_ = fVar124 * auVar176._4_4_;
              auVar199._8_4_ = fVar125 * auVar176._8_4_;
              auVar199._12_4_ = fVar126 * auVar176._12_4_;
              auVar197 = vfmadd231ps_fma(auVar199,auVar134,auVar87);
              auVar113._0_4_ = fVar102 * (float)local_940._0_4_;
              auVar113._4_4_ = fVar124 * (float)local_940._4_4_;
              auVar113._8_4_ = fVar125 * fStack_938;
              auVar113._12_4_ = fVar126 * fStack_934;
              auVar87 = vfmadd231ps_fma(auVar113,auVar134,local_920);
              auVar179._0_4_ = fVar102 * auVar87._0_4_;
              auVar179._4_4_ = fVar124 * auVar87._4_4_;
              auVar179._8_4_ = fVar125 * auVar87._8_4_;
              auVar179._12_4_ = fVar126 * auVar87._12_4_;
              auVar176 = vfmadd231ps_fma(auVar179,auVar134,auVar176);
              fVar127 = auVar131._0_4_;
              auVar114._4_4_ = fVar127;
              auVar114._0_4_ = fVar127;
              auVar114._8_4_ = fVar127;
              auVar114._12_4_ = fVar127;
              auVar87 = vfmadd213ps_fma(auVar114,local_780._0_16_,_DAT_01f7aa10);
              auVar86._0_4_ = fVar102 * auVar176._0_4_;
              auVar86._4_4_ = fVar124 * auVar176._4_4_;
              auVar86._8_4_ = fVar125 * auVar176._8_4_;
              auVar86._12_4_ = fVar126 * auVar176._12_4_;
              auVar9 = vfmadd231ps_fma(auVar86,auVar197,auVar134);
              local_5e0._0_16_ = auVar9;
              auVar87 = vsubps_avx(auVar87,auVar9);
              _local_7a0 = auVar87;
              auVar87 = vdpps_avx(auVar87,auVar87,0x7f);
              local_a40._0_16_ = auVar87;
              if (auVar87._0_4_ < 0.0) {
                local_8e0._0_16_ = ZEXT416((uint)fVar129);
                local_a00._0_16_ = auVar197;
                local_a20._0_16_ = auVar176;
                auVar258._0_4_ = sqrtf(auVar87._0_4_);
                auVar258._4_60_ = extraout_var_00;
                auVar87 = auVar258._0_16_;
                auVar176 = local_a20._0_16_;
                auVar197 = local_a00._0_16_;
              }
              else {
                auVar87 = vsqrtss_avx(auVar87,auVar87);
              }
              auVar176 = vsubps_avx(auVar176,auVar197);
              auVar221._0_4_ = auVar176._0_4_ * 3.0;
              auVar221._4_4_ = auVar176._4_4_ * 3.0;
              auVar221._8_4_ = auVar176._8_4_ * 3.0;
              auVar221._12_4_ = auVar176._12_4_ * 3.0;
              auVar176 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_8e0._0_16_,auVar8);
              auVar197 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar8,local_8e0._0_16_);
              fVar102 = local_8e0._0_4_ * 6.0;
              fVar124 = auVar176._0_4_ * 6.0;
              fVar125 = auVar197._0_4_ * 6.0;
              fVar126 = auVar8._0_4_ * 6.0;
              auVar154._0_4_ = fVar126 * (float)local_940._0_4_;
              auVar154._4_4_ = fVar126 * (float)local_940._4_4_;
              auVar154._8_4_ = fVar126 * fStack_938;
              auVar154._12_4_ = fVar126 * fStack_934;
              auVar115._4_4_ = fVar125;
              auVar115._0_4_ = fVar125;
              auVar115._8_4_ = fVar125;
              auVar115._12_4_ = fVar125;
              auVar8 = vfmadd132ps_fma(auVar115,auVar154,local_920);
              auVar155._4_4_ = fVar124;
              auVar155._0_4_ = fVar124;
              auVar155._8_4_ = fVar124;
              auVar155._12_4_ = fVar124;
              auVar8 = vfmadd132ps_fma(auVar155,auVar8,local_930);
              auVar176 = vdpps_avx(auVar221,auVar221,0x7f);
              auVar116._4_4_ = fVar102;
              auVar116._0_4_ = fVar102;
              auVar116._8_4_ = fVar102;
              auVar116._12_4_ = fVar102;
              auVar9 = vfmadd132ps_fma(auVar116,auVar8,local_910);
              auVar8 = vblendps_avx(auVar176,_DAT_01f7aa10,0xe);
              auVar197 = vrsqrtss_avx(auVar8,auVar8);
              fVar125 = auVar176._0_4_;
              fVar102 = auVar197._0_4_;
              auVar197 = vdpps_avx(auVar221,auVar9,0x7f);
              fVar102 = fVar102 * 1.5 + fVar125 * -0.5 * fVar102 * fVar102 * fVar102;
              auVar117._0_4_ = auVar9._0_4_ * fVar125;
              auVar117._4_4_ = auVar9._4_4_ * fVar125;
              auVar117._8_4_ = auVar9._8_4_ * fVar125;
              auVar117._12_4_ = auVar9._12_4_ * fVar125;
              fVar124 = auVar197._0_4_;
              auVar200._0_4_ = auVar221._0_4_ * fVar124;
              auVar200._4_4_ = auVar221._4_4_ * fVar124;
              auVar200._8_4_ = auVar221._8_4_ * fVar124;
              auVar200._12_4_ = auVar221._12_4_ * fVar124;
              auVar197 = vsubps_avx(auVar117,auVar200);
              auVar8 = vrcpss_avx(auVar8,auVar8);
              auVar9 = vfnmadd213ss_fma(auVar8,auVar176,ZEXT416(0x40000000));
              fVar124 = auVar8._0_4_ * auVar9._0_4_;
              auVar8 = vmaxss_avx(ZEXT416((uint)local_7c0._0_4_),
                                  ZEXT416((uint)(fVar127 * (float)local_800._0_4_)));
              uVar66 = CONCAT44(auVar221._4_4_,auVar221._0_4_);
              auVar235._0_8_ = uVar66 ^ 0x8000000080000000;
              auVar235._8_4_ = -auVar221._8_4_;
              auVar235._12_4_ = -auVar221._12_4_;
              local_840._0_4_ = fVar102 * auVar197._0_4_ * fVar124;
              local_840._4_4_ = fVar102 * auVar197._4_4_ * fVar124;
              local_840._8_4_ = fVar102 * auVar197._8_4_ * fVar124;
              local_840._12_4_ = fVar102 * auVar197._12_4_ * fVar124;
              local_820._0_4_ = auVar221._0_4_ * fVar102;
              local_820._4_4_ = auVar221._4_4_ * fVar102;
              local_820._8_4_ = auVar221._8_4_ * fVar102;
              local_820._12_4_ = auVar221._12_4_ * fVar102;
              local_8e0._0_16_ = auVar221;
              if (fVar125 < -fVar125) {
                local_a00._0_4_ = auVar87._0_4_;
                local_a20._0_16_ = auVar235;
                fVar102 = sqrtf(fVar125);
                auVar87 = ZEXT416((uint)local_a00._0_4_);
                auVar235 = local_a20._0_16_;
                auVar176 = local_820._0_16_;
              }
              else {
                auVar176 = vsqrtss_avx(auVar176,auVar176);
                fVar102 = auVar176._0_4_;
                auVar176 = local_820._0_16_;
              }
              auVar240 = ZEXT1664(auVar176);
              local_a00._0_16_ = vdpps_avx(_local_7a0,auVar176,0x7f);
              auVar78 = vfmadd213ss_fma(ZEXT416((uint)local_7c0._0_4_),auVar87,
                                        ZEXT416((uint)auVar8._0_4_));
              auVar197 = vdpps_avx(auVar235,auVar176,0x7f);
              auVar9 = vdpps_avx(_local_7a0,local_840._0_16_,0x7f);
              auVar79 = vdpps_avx(local_780._0_16_,auVar176,0x7f);
              auVar87 = vfmadd213ss_fma(ZEXT416((uint)(auVar87._0_4_ + 1.0)),
                                        ZEXT416((uint)((float)local_7c0._0_4_ / fVar102)),auVar78);
              local_a20._0_4_ = auVar87._0_4_;
              auVar88._0_4_ = local_a00._0_4_ * local_a00._0_4_;
              auVar88._4_4_ = local_a00._4_4_ * local_a00._4_4_;
              auVar88._8_4_ = local_a00._8_4_ * local_a00._8_4_;
              auVar88._12_4_ = local_a00._12_4_ * local_a00._12_4_;
              auVar87 = vdpps_avx(_local_7a0,auVar235,0x7f);
              auVar130 = vsubps_avx(local_a40._0_16_,auVar88);
              auVar78 = vrsqrtss_avx(auVar130,auVar130);
              fVar124 = auVar130._0_4_;
              fVar102 = auVar78._0_4_;
              fVar102 = fVar102 * 1.5 + fVar124 * -0.5 * fVar102 * fVar102 * fVar102;
              auVar78 = vdpps_avx(_local_7a0,local_780._0_16_,0x7f);
              local_820._0_16_ = ZEXT416((uint)(auVar197._0_4_ + auVar9._0_4_));
              local_840._0_16_ = vfnmadd231ss_fma(auVar87,local_a00._0_16_,local_820._0_16_);
              auVar87 = vfnmadd231ss_fma(auVar78,local_a00._0_16_,auVar79);
              if (fVar124 < 0.0) {
                local_600._0_16_ = auVar79;
                local_620._0_4_ = fVar102;
                local_640._0_16_ = auVar87;
                auVar240 = ZEXT1664(auVar176);
                fVar124 = sqrtf(fVar124);
                fVar102 = (float)local_620._0_4_;
                auVar87 = local_640._0_16_;
                auVar79 = local_600._0_16_;
              }
              else {
                auVar176 = vsqrtss_avx(auVar130,auVar130);
                fVar124 = auVar176._0_4_;
              }
              auVar249 = ZEXT1664(local_a40._0_16_);
              auVar265 = ZEXT3264(local_980);
              auVar253 = ZEXT3264(local_9a0);
              auVar258 = ZEXT3264(local_9c0);
              auVar226 = ZEXT3264(local_9e0);
              auVar232 = ZEXT3264(local_900);
              auVar176 = vpermilps_avx(local_5e0._0_16_,0xff);
              fVar124 = fVar124 - auVar176._0_4_;
              auVar197 = vshufps_avx(local_8e0._0_16_,local_8e0._0_16_,0xff);
              auVar176 = vfmsub213ss_fma(local_840._0_16_,ZEXT416((uint)fVar102),auVar197);
              auVar156._0_8_ = auVar79._0_8_ ^ 0x8000000080000000;
              auVar156._8_4_ = auVar79._8_4_ ^ 0x80000000;
              auVar156._12_4_ = auVar79._12_4_ ^ 0x80000000;
              auVar180._0_8_ = auVar176._0_8_ ^ 0x8000000080000000;
              auVar180._8_4_ = auVar176._8_4_ ^ 0x80000000;
              auVar180._12_4_ = auVar176._12_4_ ^ 0x80000000;
              auVar87 = ZEXT416((uint)(auVar87._0_4_ * fVar102));
              auVar176 = vfmsub231ss_fma(ZEXT416((uint)(auVar79._0_4_ * auVar176._0_4_)),
                                         local_820._0_16_,auVar87);
              auVar87 = vinsertps_avx(auVar180,auVar87,0x1c);
              uVar74 = auVar176._0_4_;
              auVar181._4_4_ = uVar74;
              auVar181._0_4_ = uVar74;
              auVar181._8_4_ = uVar74;
              auVar181._12_4_ = uVar74;
              auVar87 = vdivps_avx(auVar87,auVar181);
              auVar176 = vinsertps_avx(local_820._0_16_,auVar156,0x10);
              auVar176 = vdivps_avx(auVar176,auVar181);
              fVar102 = local_a00._0_4_;
              auVar135._0_4_ = fVar102 * auVar87._0_4_ + fVar124 * auVar176._0_4_;
              auVar135._4_4_ = fVar102 * auVar87._4_4_ + fVar124 * auVar176._4_4_;
              auVar135._8_4_ = fVar102 * auVar87._8_4_ + fVar124 * auVar176._8_4_;
              auVar135._12_4_ = fVar102 * auVar87._12_4_ + fVar124 * auVar176._12_4_;
              auVar131 = vsubps_avx(auVar131,auVar135);
              auVar87 = vandps_avx(local_a00._0_16_,local_950);
              if (auVar87._0_4_ < (float)local_a20._0_4_) {
                auVar8 = vfmadd231ss_fma(ZEXT416((uint)((float)local_a20._0_4_ + auVar8._0_4_)),
                                         local_660._0_16_,ZEXT416(0x36000000));
                auVar87 = vandps_avx(ZEXT416((uint)fVar124),local_950);
                if (auVar87._0_4_ < auVar8._0_4_) {
                  fVar102 = auVar131._0_4_ + (float)local_750._0_4_;
                  if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar102) &&
                     (fVar124 = (ray->super_RayK<1>).tfar, fVar102 <= fVar124)) {
                    auVar131 = vmovshdup_avx(auVar131);
                    fVar125 = auVar131._0_4_;
                    if ((0.0 <= fVar125) && (fVar125 <= 1.0)) {
                      auVar131 = vrsqrtss_avx(local_a40._0_16_,local_a40._0_16_);
                      fVar126 = auVar131._0_4_;
                      pGVar4 = (context->scene->geometries).items[uVar71].ptr;
                      if ((pGVar4->mask & (ray->super_RayK<1>).mask) != 0) {
                        fVar126 = fVar126 * 1.5 +
                                  local_a40._0_4_ * -0.5 * fVar126 * fVar126 * fVar126;
                        auVar157._0_4_ = fVar126 * (float)local_7a0._0_4_;
                        auVar157._4_4_ = fVar126 * (float)local_7a0._4_4_;
                        auVar157._8_4_ = fVar126 * fStack_798;
                        auVar157._12_4_ = fVar126 * fStack_794;
                        auVar176 = vfmadd213ps_fma(auVar197,auVar157,local_8e0._0_16_);
                        auVar131 = vshufps_avx(auVar157,auVar157,0xc9);
                        auVar87 = vshufps_avx(local_8e0._0_16_,local_8e0._0_16_,0xc9);
                        auVar158._0_4_ = auVar157._0_4_ * auVar87._0_4_;
                        auVar158._4_4_ = auVar157._4_4_ * auVar87._4_4_;
                        auVar158._8_4_ = auVar157._8_4_ * auVar87._8_4_;
                        auVar158._12_4_ = auVar157._12_4_ * auVar87._12_4_;
                        auVar8 = vfmsub231ps_fma(auVar158,local_8e0._0_16_,auVar131);
                        auVar131 = vshufps_avx(auVar8,auVar8,0xc9);
                        auVar87 = vshufps_avx(auVar176,auVar176,0xc9);
                        auVar8 = vshufps_avx(auVar8,auVar8,0xd2);
                        auVar89._0_4_ = auVar176._0_4_ * auVar8._0_4_;
                        auVar89._4_4_ = auVar176._4_4_ * auVar8._4_4_;
                        auVar89._8_4_ = auVar176._8_4_ * auVar8._8_4_;
                        auVar89._12_4_ = auVar176._12_4_ * auVar8._12_4_;
                        auVar131 = vfmsub231ps_fma(auVar89,auVar131,auVar87);
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          (ray->super_RayK<1>).tfar = fVar102;
                          auVar87 = vshufps_avx(auVar131,auVar131,0xe9);
                          uVar75 = vmovlps_avx(auVar87);
                          *(undefined8 *)&(ray->Ng).field_0 = uVar75;
                          (ray->Ng).field_0.field_0.z = auVar131._0_4_;
                          ray->u = fVar125;
                          ray->v = 0.0;
                          ray->primID = (uint)local_880;
                          ray->geomID = uVar71;
                          ray->instID[0] = context->user->instID[0];
                          ray->instPrimID[0] = context->user->instPrimID[0];
                        }
                        else {
                          auVar87 = vshufps_avx(auVar131,auVar131,0xe9);
                          local_8b0 = vmovlps_avx(auVar87);
                          local_8a8 = auVar131._0_4_;
                          local_8a4 = fVar125;
                          local_8a0 = 0;
                          local_89c = (uint)local_880;
                          local_898 = uVar71;
                          local_894 = context->user->instID[0];
                          local_890 = context->user->instPrimID[0];
                          (ray->super_RayK<1>).tfar = fVar102;
                          local_a44 = -1;
                          local_a78.valid = &local_a44;
                          local_a78.geometryUserPtr = pGVar4->userPtr;
                          local_a78.context = context->user;
                          local_a78.hit = (RTCHitN *)&local_8b0;
                          local_a78.N = 1;
                          local_a78.ray = (RTCRayN *)ray;
                          if (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_015db628:
                            p_Var6 = context->args->filter;
                            if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                              auVar240 = ZEXT1664(auVar240._0_16_);
                              auVar249 = ZEXT1664(auVar249._0_16_);
                              (*p_Var6)(&local_a78);
                              if (*local_a78.valid == 0) goto LAB_015db6b6;
                            }
                            (((Vec3f *)((long)local_a78.ray + 0x30))->field_0).components[0] =
                                 *(float *)local_a78.hit;
                            (((Vec3f *)((long)local_a78.ray + 0x30))->field_0).field_0.y =
                                 *(float *)(local_a78.hit + 4);
                            (((Vec3f *)((long)local_a78.ray + 0x30))->field_0).field_0.z =
                                 *(float *)(local_a78.hit + 8);
                            *(float *)((long)local_a78.ray + 0x3c) = *(float *)(local_a78.hit + 0xc)
                            ;
                            *(float *)((long)local_a78.ray + 0x40) =
                                 *(float *)(local_a78.hit + 0x10);
                            *(float *)((long)local_a78.ray + 0x44) =
                                 *(float *)(local_a78.hit + 0x14);
                            *(float *)((long)local_a78.ray + 0x48) =
                                 *(float *)(local_a78.hit + 0x18);
                            *(float *)((long)local_a78.ray + 0x4c) =
                                 *(float *)(local_a78.hit + 0x1c);
                            *(float *)((long)local_a78.ray + 0x50) =
                                 *(float *)(local_a78.hit + 0x20);
                          }
                          else {
                            auVar240 = ZEXT1664(auVar240._0_16_);
                            auVar249 = ZEXT1664(local_a40._0_16_);
                            (*pGVar4->intersectionFilterN)(&local_a78);
                            if (*local_a78.valid != 0) goto LAB_015db628;
LAB_015db6b6:
                            (ray->super_RayK<1>).tfar = fVar124;
                          }
                          auVar265 = ZEXT3264(local_980);
                          auVar253 = ZEXT3264(local_9a0);
                          auVar258 = ZEXT3264(local_9c0);
                          auVar226 = ZEXT3264(local_9e0);
                          auVar232 = ZEXT3264(local_900);
                        }
                      }
                    }
                  }
                  break;
                }
              }
              lVar70 = lVar70 + -1;
            } while (lVar70 != 0);
            auVar214 = local_5c0;
            fVar102 = (ray->super_RayK<1>).tfar;
            auVar97._4_4_ = fVar102;
            auVar97._0_4_ = fVar102;
            auVar97._8_4_ = fVar102;
            auVar97._12_4_ = fVar102;
            auVar97._16_4_ = fVar102;
            auVar97._20_4_ = fVar102;
            auVar97._24_4_ = fVar102;
            auVar97._28_4_ = fVar102;
            auVar91 = vcmpps_avx(_local_6c0,auVar97,2);
            local_5c0 = vandps_avx(auVar91,local_5c0);
            auVar214 = auVar214 & auVar91;
          } while ((((((((auVar214 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (auVar214 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar214 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(auVar214 >> 0x7f,0) != '\0') ||
                     (auVar214 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(auVar214 >> 0xbf,0) != '\0') ||
                   (auVar214 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   auVar214[0x1f] < '\0');
        }
        auVar144._0_4_ = (float)local_7e0._0_4_ + local_3c0._0_4_;
        auVar144._4_4_ = (float)local_7e0._4_4_ + local_3c0._4_4_;
        auVar144._8_4_ = fStack_7d8 + local_3c0._8_4_;
        auVar144._12_4_ = fStack_7d4 + local_3c0._12_4_;
        auVar144._16_4_ = fStack_7d0 + local_3c0._16_4_;
        auVar144._20_4_ = fStack_7cc + local_3c0._20_4_;
        auVar144._24_4_ = fStack_7c8 + local_3c0._24_4_;
        auVar144._28_4_ = fStack_7c4 + local_3c0._28_4_;
        auVar214 = vcmpps_avx(auVar144,auVar97,2);
        auVar91 = vandps_avx(local_480,local_580);
        auVar91 = vandps_avx(auVar214,auVar91);
        auVar166._0_4_ = (float)local_7e0._0_4_ + local_400._0_4_;
        auVar166._4_4_ = (float)local_7e0._4_4_ + local_400._4_4_;
        auVar166._8_4_ = fStack_7d8 + local_400._8_4_;
        auVar166._12_4_ = fStack_7d4 + local_400._12_4_;
        auVar166._16_4_ = fStack_7d0 + local_400._16_4_;
        auVar166._20_4_ = fStack_7cc + local_400._20_4_;
        auVar166._24_4_ = fStack_7c8 + local_400._24_4_;
        auVar166._28_4_ = fStack_7c4 + local_400._28_4_;
        auVar224 = vcmpps_avx(auVar166,auVar97,2);
        auVar214 = vandps_avx(local_720,local_700);
        auVar214 = vandps_avx(auVar224,auVar214);
        auVar214 = vorps_avx(auVar91,auVar214);
        if ((((((((auVar214 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar214 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar214 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar214 >> 0x7f,0) != '\0') ||
              (auVar214 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar214 >> 0xbf,0) != '\0') ||
            (auVar214 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar214[0x1f] < '\0') {
          *(undefined1 (*) [32])(auStack_180 + uVar73 * 0x60) = auVar214;
          auVar91 = vblendvps_avx(local_400,local_3c0,auVar91);
          *(undefined1 (*) [32])(auStack_160 + uVar73 * 0x60) = auVar91;
          uVar75 = vmovlps_avx(local_410);
          (&uStack_140)[uVar73 * 0xc] = uVar75;
          aiStack_138[uVar73 * 0x18] = local_acc + 1;
          iVar72 = iVar72 + 1;
        }
      }
      auVar224 = auVar226._0_32_;
    }
    auVar214 = local_360;
    fVar102 = (ray->super_RayK<1>).tfar;
    if (iVar72 == 0) break;
    fVar124 = (ray->super_RayK<1>).tfar;
    auVar118._4_4_ = fVar124;
    auVar118._0_4_ = fVar124;
    auVar118._8_4_ = fVar124;
    auVar118._12_4_ = fVar124;
    auVar118._16_4_ = fVar124;
    auVar118._20_4_ = fVar124;
    auVar118._24_4_ = fVar124;
    auVar118._28_4_ = fVar124;
    uVar68 = -iVar72;
    pauVar67 = (undefined1 (*) [32])(auStack_180 + (ulong)(iVar72 - 1) * 0x60);
    fVar124 = (float)local_7e0._0_4_;
    fVar125 = (float)local_7e0._4_4_;
    fVar126 = fStack_7d8;
    fVar129 = fStack_7d4;
    fVar127 = fStack_7d0;
    fVar128 = fStack_7cc;
    fVar190 = fStack_7c8;
    fVar101 = fStack_7c4;
    while( true ) {
      auVar91 = pauVar67[1];
      auVar138._0_4_ = fVar124 + auVar91._0_4_;
      auVar138._4_4_ = fVar125 + auVar91._4_4_;
      auVar138._8_4_ = fVar126 + auVar91._8_4_;
      auVar138._12_4_ = fVar129 + auVar91._12_4_;
      auVar138._16_4_ = fVar127 + auVar91._16_4_;
      auVar138._20_4_ = fVar128 + auVar91._20_4_;
      auVar138._24_4_ = fVar190 + auVar91._24_4_;
      auVar138._28_4_ = fVar101 + auVar91._28_4_;
      auVar139 = vcmpps_avx(auVar138,auVar118,2);
      auVar10 = vandps_avx(auVar139,*pauVar67);
      local_3c0 = auVar10;
      auVar139 = *pauVar67 & auVar139;
      if ((((((((auVar139 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar139 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar139 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar139 >> 0x7f,0) != '\0') ||
            (auVar139 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar139 >> 0xbf,0) != '\0') ||
          (auVar139 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar139[0x1f] < '\0') break;
      pauVar67 = pauVar67 + -3;
      uVar68 = uVar68 + 1;
      fVar124 = (float)local_7e0._0_4_;
      fVar125 = (float)local_7e0._4_4_;
      fVar126 = fStack_7d8;
      fVar129 = fStack_7d4;
      fVar127 = fStack_7d0;
      fVar128 = fStack_7cc;
      fVar190 = fStack_7c8;
      fVar101 = fStack_7c4;
      if (uVar68 == 0) goto LAB_015db874;
    }
    auVar95._8_4_ = 0x7f800000;
    auVar95._0_8_ = 0x7f8000007f800000;
    auVar95._12_4_ = 0x7f800000;
    auVar95._16_4_ = 0x7f800000;
    auVar95._20_4_ = 0x7f800000;
    auVar95._24_4_ = 0x7f800000;
    auVar95._28_4_ = 0x7f800000;
    auVar91 = vblendvps_avx(auVar95,auVar91,auVar10);
    auVar139 = vshufps_avx(auVar91,auVar91,0xb1);
    auVar139 = vminps_avx(auVar91,auVar139);
    auVar160 = vshufpd_avx(auVar139,auVar139,5);
    auVar139 = vminps_avx(auVar139,auVar160);
    auVar160 = vpermpd_avx2(auVar139,0x4e);
    auVar139 = vminps_avx(auVar139,auVar160);
    auVar91 = vcmpps_avx(auVar91,auVar139,0);
    auVar139 = auVar10 & auVar91;
    if ((((((((auVar139 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar139 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar139 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar139 >> 0x7f,0) != '\0') ||
          (auVar139 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar139 >> 0xbf,0) != '\0') ||
        (auVar139 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar139[0x1f] < '\0') {
      auVar10 = vandps_avx(auVar91,auVar10);
    }
    uVar66 = *(ulong *)pauVar67[2];
    auVar82._8_8_ = 0;
    auVar82._0_8_ = uVar66;
    uVar69 = vmovmskps_avx(auVar10);
    iVar72 = 0;
    for (; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x80000000) {
      iVar72 = iVar72 + 1;
    }
    *(undefined4 *)(local_3c0 + (uint)(iVar72 << 2)) = 0;
    uVar69 = ~uVar68;
    if ((((((((local_3c0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_3c0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_3c0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_3c0 >> 0x7f,0) != '\0') ||
          (local_3c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_3c0 >> 0xbf,0) != '\0') ||
        (local_3c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_3c0[0x1f] < '\0') {
      uVar69 = -uVar68;
    }
    uVar73 = (ulong)uVar69;
    local_acc = *(int *)(pauVar67[2] + 8);
    *pauVar67 = local_3c0;
    uVar74 = (undefined4)uVar66;
    auVar119._4_4_ = uVar74;
    auVar119._0_4_ = uVar74;
    auVar119._8_4_ = uVar74;
    auVar119._12_4_ = uVar74;
    auVar119._16_4_ = uVar74;
    auVar119._20_4_ = uVar74;
    auVar119._24_4_ = uVar74;
    auVar119._28_4_ = uVar74;
    auVar131 = vmovshdup_avx(auVar82);
    auVar131 = vsubps_avx(auVar131,auVar82);
    auVar96._0_4_ = auVar131._0_4_;
    auVar96._4_4_ = auVar96._0_4_;
    auVar96._8_4_ = auVar96._0_4_;
    auVar96._12_4_ = auVar96._0_4_;
    auVar96._16_4_ = auVar96._0_4_;
    auVar96._20_4_ = auVar96._0_4_;
    auVar96._24_4_ = auVar96._0_4_;
    auVar96._28_4_ = auVar96._0_4_;
    auVar131 = vfmadd132ps_fma(auVar96,auVar119,_DAT_01faff20);
    local_400 = ZEXT1632(auVar131);
    local_410._8_8_ = 0;
    local_410._0_8_ = *(ulong *)(local_400 + (uint)(iVar72 << 2));
    uVar66 = local_880;
  } while( true );
LAB_015db874:
  auVar90._4_4_ = fVar102;
  auVar90._0_4_ = fVar102;
  auVar90._8_4_ = fVar102;
  auVar90._12_4_ = fVar102;
  auVar131 = vcmpps_avx(local_420,auVar90,2);
  uVar71 = vmovmskps_avx(auVar131);
  uVar65 = uVar71 & uVar65 - 1 & uVar65;
  if (uVar65 == 0) {
    return;
  }
  goto LAB_015d92ef;
}

Assistant:

static __forceinline void intersect_h(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          Intersector().intersect(pre,ray,context,geom,primID,p0,t0,p1,t1,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }